

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsLoadNonMS::Run(BasicAllTargetsLoadNonMS *this)

{
  CallLogWrapper *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  GLuint GVar10;
  GLint GVar11;
  ostream *poVar12;
  size_t sVar13;
  undefined7 extraout_var;
  GLuint GVar14;
  int iVar15;
  GLenum GVar16;
  vec4 *pvVar17;
  char *pcVar18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_540;
  byte local_512;
  byte local_511;
  BasicAllTargetsLoadNonMS *local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_508;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  GLuint textures [7];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint buffer;
  undefined8 local_490;
  char local_488;
  undefined1 uStack_487;
  undefined6 uStack_486;
  Vector<float,_4> local_478;
  long local_468 [2];
  GLchar name [32];
  GLint uniforms;
  undefined8 local_430;
  ulong local_428;
  undefined1 local_420;
  Vector<float,_4> local_418;
  ulong *local_408;
  undefined8 local_400;
  ulong local_3f8;
  undefined1 local_3f0;
  ulong *local_3e8;
  undefined8 local_3e0;
  ulong local_3d8;
  undefined1 local_3d0;
  ulong *local_3c8;
  undefined8 local_3c0;
  ulong local_3b8;
  undefined1 local_3b0;
  char *local_3a8;
  undefined8 local_3a0;
  char local_398;
  undefined1 uStack_397;
  undefined6 uStack_396;
  char *local_388;
  undefined8 local_380;
  char local_378;
  undefined1 uStack_377;
  undefined6 uStack_376;
  char *local_368;
  undefined8 local_360;
  char local_358;
  undefined1 uStack_357;
  undefined6 uStack_356;
  char *local_348;
  undefined8 local_340;
  char local_338;
  undefined1 uStack_337;
  undefined6 uStack_336;
  char *local_328;
  undefined8 local_320;
  char local_318;
  undefined1 uStack_317;
  undefined6 uStack_316;
  char *local_308;
  undefined8 local_300;
  char local_2f8;
  undefined1 uStack_2f7;
  undefined6 uStack_2f6;
  char *local_2e8;
  undefined8 local_2e0;
  char local_2d8;
  undefined1 uStack_2d7;
  undefined6 uStack_2d6;
  char *local_2c8;
  undefined8 local_2c0;
  char local_2b8;
  undefined1 uStack_2b7;
  undefined6 uStack_2b6;
  char *local_2a8;
  undefined8 local_2a0;
  char local_298;
  undefined1 uStack_297;
  undefined6 uStack_296;
  char *local_288;
  undefined8 local_280;
  char local_278;
  undefined1 uStack_277;
  undefined6 uStack_276;
  char *local_268;
  undefined8 local_260;
  char local_258;
  undefined1 uStack_257;
  undefined6 uStack_256;
  char *local_248;
  undefined8 local_240;
  char local_238;
  undefined1 uStack_237;
  undefined6 uStack_236;
  char *local_228;
  undefined8 local_220;
  char local_218;
  undefined1 uStack_217;
  undefined6 uStack_216;
  CallLogWrapper *local_208;
  char *local_200;
  undefined8 local_1f8;
  char local_1f0;
  undefined1 uStack_1ef;
  undefined6 uStack_1ee;
  GLuint *local_1e0;
  value_type local_1d8;
  char local_1c8;
  undefined1 uStack_1c7;
  undefined6 uStack_1c6;
  value_type local_1b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  name_index_map;
  ios_base local_138 [264];
  
  local_1e0 = &this->m_vao;
  local_510 = this;
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,local_1e0,&this->m_vbo,(GLuint *)0x0);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = 10.0;
  local_1b8.m_data[2] = -200.0;
  local_1b8.m_data[3] = 3000.0;
  local_418.m_data[0] = -1.0;
  local_418.m_data[1] = 10.0;
  local_418.m_data[2] = -200.0;
  local_418.m_data[3] = 3000.0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&name_index_map,
             "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
  local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
  local_540.first.field_2._M_local_buf[6] = 'f';
  local_540.first._M_string_length = 7;
  local_540.first.field_2._M_local_buf[7] = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,local_540.first._M_dataplus._M_p,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
  name._0_8_ = name + 0x10;
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name[0x10] = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)name._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"image1D g_image_1d;\nlayout(",0x1b);
  local_508 = &local_4f8;
  local_500 = 7;
  local_4f8._M_allocated_capacity = 0x66323361626772;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_508->_M_local_buf,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
  textures._0_8_ = textures + 4;
  textures[2] = 0;
  textures[3] = 0;
  textures[4]._0_1_ = 0;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)textures._0_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"image2D g_image_2d;\nlayout(",0x1b);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x7;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x66323361626772;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(char *)data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
  _buffer = &local_488;
  local_490 = 0;
  local_488 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,_buffer,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"image3D g_image_3d;\nlayout(",0x1b);
  _uniforms = &local_428;
  local_430 = 7;
  local_428 = 0x66323361626772;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)_uniforms,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
  local_228 = &local_218;
  local_220 = 0;
  local_218 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_228,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"image2DRect g_image_2drect;\nlayout(",0x23);
  local_3c8 = &local_3b8;
  local_3c0 = 7;
  local_3b8 = 0x66323361626772;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3c8,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
  local_248 = &local_238;
  local_240 = 0;
  local_238 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_248,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"imageBuffer g_image_buffer;\nlayout(",0x23);
  local_3e8 = &local_3d8;
  local_3e0 = 7;
  local_3d8 = 0x66323361626772;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3e8,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
  local_268 = &local_258;
  local_260 = 0;
  local_258 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_268,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"image1DArray g_image_1darray;\nlayout(",0x25);
  local_408 = &local_3f8;
  local_400 = 7;
  local_3f8 = 0x66323361626772;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_408,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
  local_288 = &local_278;
  local_280 = 0;
  local_278 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_288,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x7c);
  local_2a8 = &local_298;
  local_2a0 = 0;
  local_298 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2a8,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ",0x39);
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2c8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
             ,0x56);
  local_2e8 = &local_2d8;
  local_2e0 = 0;
  local_2d8 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2e8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
             ,0x62);
  local_308 = &local_2f8;
  local_300 = 0;
  local_2f8 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_308,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
             ,99);
  local_328 = &local_318;
  local_320 = 0;
  local_318 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_328,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
             ,0x59);
  local_348 = &local_338;
  local_340 = 0;
  local_338 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_348,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
             ,0x5c);
  local_368 = &local_358;
  local_360 = 0;
  local_358 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_368,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
             ,0x66);
  local_388 = &local_378;
  local_380 = 0;
  local_378 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_388,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
             ,0x67);
  local_3a8 = &local_398;
  local_3a0 = 0;
  local_398 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_3a8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
             ,100);
  local_200 = &local_1f0;
  local_1f8 = 0;
  local_1f0 = '\0';
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_200,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
             ,0x65);
  local_1d8.m_data[2] = 0.0;
  local_1d8.m_data[3] = 0.0;
  local_1c8 = '\0';
  local_1d8.m_data._0_8_ = &local_1c8;
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,&local_1c8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
  poVar12 = tcu::operator<<(poVar12,&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}",0x27);
  if ((char *)local_1d8.m_data._0_8_ != &local_1c8) {
    operator_delete((void *)local_1d8.m_data._0_8_,
                    CONCAT62(uStack_1c6,CONCAT11(uStack_1c7,local_1c8)) + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
  }
  if (local_408 != &local_3f8) {
    operator_delete(local_408,local_3f8 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,local_3d8 + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,local_3b8 + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
  }
  if (_uniforms != &local_428) {
    operator_delete(_uniforms,local_428 + 1);
  }
  if (_buffer != &local_488) {
    operator_delete(_buffer,CONCAT62(uStack_486,CONCAT11(uStack_487,local_488)) + 1);
  }
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1))
    ;
  }
  if ((GLuint *)textures._0_8_ != textures + 4) {
    operator_delete((void *)textures._0_8_,
                    CONCAT44(textures[5],
                             CONCAT22(textures[4]._2_2_,
                                      CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  p_Var3 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
  std::ios_base::~ios_base(local_138);
  GVar10 = ShaderImageLoadStoreBase::BuildProgram
                     (&local_510->super_ShaderImageLoadStoreBase,
                      "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                      ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_478.m_data._0_8_,
                      (bool *)0x0);
  if ((long *)local_478.m_data._0_8_ != local_468) {
    operator_delete((void *)local_478.m_data._0_8_,local_468[0] + 1);
  }
  pCVar1 = &(local_510->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
  glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x200,&local_1b8,(allocator_type *)&name_index_map);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde0,textures[0]);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage1D
            (pCVar1,0xde0,0,0x8814,0x10,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde0,0);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,textures[1]);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar1,0xde1,0,0x8814,0x10,0x10,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,0);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x806f,textures[2]);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar1,0x806f,0,0x8814,0x10,0x10,2,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x806f,0);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x84f5,textures[3]);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x84f5,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar1,0x84f5,0,0x8814,0x10,0x10,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x84f5,0);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData
            (pCVar1,0x8c2a,0x100,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e8);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture
            (pCVar1,0x8c2a,
             CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])));
  glu::CallLogWrapper::glTexBuffer(pCVar1,0x8c2a,0x8814,buffer);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c18,textures[5]);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c18,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage2D
            (pCVar1,0x8c18,0,0x8814,0x10,2,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c18,0);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,textures[6]);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexImage3D
            (pCVar1,0x8c1a,0,0x8814,0x10,0x10,2,0,0x1908,0x1406,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,0,textures[0],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[1],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[2],0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[3],0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            (pCVar1,4,CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])
                              ),0,'\0',0,35000,0x8814);
  glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[5],0,'\x01',0,35000,0x8814);
  pvVar17 = (vec4 *)0x0;
  glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[6],0,'\x01',0,35000,0x8814);
  glu::CallLogWrapper::glClear(pCVar1,0x4000);
  glu::CallLogWrapper::glUseProgram(pCVar1,GVar10);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,0);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,1);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,2);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,3);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,4);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,5);
  GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,6);
  glu::CallLogWrapper::glBindVertexArray(pCVar1,*local_1e0);
  iVar15 = 0x10;
  glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
  name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
  bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&local_510->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                     iVar15,pvVar17);
  GVar16 = (GLenum)pvVar17;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar10,0x8b86,&uniforms);
  if (uniforms != 7) {
    bVar4 = false;
    anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
  }
  local_208 = pCVar1;
  if (uniforms != 0) {
    GVar14 = 0;
    do {
      pcVar18 = name;
      glu::CallLogWrapper::glGetActiveUniformName(local_208,GVar10,GVar14,0x20,(GLsizei *)0x0,name);
      GVar16 = (GLenum)pcVar18;
      local_508 = &local_4f8;
      sVar13 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,name,name + sVar13);
      local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ =
           (undefined4)local_4f8._M_allocated_capacity;
      local_540.first.field_2._M_local_buf[6] = (char)((ulong)local_4f8._0_8_ >> 0x30);
      local_540.first.field_2._M_local_buf[7] = (char)((ulong)local_4f8._0_8_ >> 0x38);
      local_540.first.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)local_4f8._0_8_ >> 0x20);
      if (local_508 == &local_4f8) {
        local_540.first.field_2._M_local_buf[9] = (char)local_4f8._9_7_;
        local_540.first.field_2._M_local_buf[10] = (char)((uint7)local_4f8._9_7_ >> 8);
        local_540.first.field_2._M_local_buf[0xb] = (char)((uint7)local_4f8._9_7_ >> 0x10);
        local_540.first.field_2._M_local_buf[0xc] = (char)((uint7)local_4f8._9_7_ >> 0x18);
        local_540.first.field_2._M_local_buf[0xd] = (char)((uint7)local_4f8._9_7_ >> 0x20);
        local_540.first.field_2._M_local_buf[0xe] = (char)((uint7)local_4f8._9_7_ >> 0x28);
        local_540.first.field_2._M_local_buf[0xf] = (char)((uint7)local_4f8._9_7_ >> 0x30);
      }
      else {
        local_540.first._M_dataplus._M_p = (pointer)local_508;
      }
      local_540.first._M_string_length = local_500;
      local_500 = 0;
      local_4f8._M_allocated_capacity = local_4f8._M_allocated_capacity & 0xffffffffffffff00;
      local_540.second = GVar14;
      local_508 = &local_4f8;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                  *)&name_index_map,&local_540);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      if (local_508 != &local_4f8) {
        operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
      }
      GVar14 = GVar14 + 1;
    } while (GVar14 < (uint)uniforms);
  }
  paVar2 = &local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_540.first.field_2._M_local_buf[6] = 'e';
  local_540.first.field_2._M_local_buf[7] = '_';
  local_540.first.field_2._M_local_buf[8] = '1';
  local_540.first.field_2._M_local_buf[9] = 'd';
  local_540.first._M_string_length = 10;
  local_540.first.field_2._M_local_buf[10] = '\0';
  local_540.first._M_dataplus._M_p = (pointer)paVar2;
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                     &name_index_map,0x904c,GVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar2 = &local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_540.first.field_2._M_local_buf[6] = 'e';
  local_540.first.field_2._M_local_buf[7] = '_';
  local_540.first.field_2._M_local_buf[8] = '2';
  local_540.first.field_2._M_local_buf[9] = 'd';
  local_540.first._M_string_length = 10;
  local_540.first.field_2._M_local_buf[10] = '\0';
  local_540.first._M_dataplus._M_p = (pointer)paVar2;
  bVar6 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                     &name_index_map,0x904d,GVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar2 = &local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_540.first.field_2._M_local_buf[6] = 'e';
  local_540.first.field_2._M_local_buf[7] = '_';
  local_540.first.field_2._M_local_buf[8] = '3';
  local_540.first.field_2._M_local_buf[9] = 'd';
  local_540.first._M_string_length = 10;
  local_540.first.field_2._M_local_buf[10] = '\0';
  local_540.first._M_dataplus._M_p = (pointer)paVar2;
  bVar7 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                     &name_index_map,0x904e,GVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar2 = &local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_540.first.field_2._M_local_buf[6] = 'e';
  local_540.first.field_2._M_local_buf[7] = '_';
  local_540.first.field_2._M_local_buf[8] = '2';
  local_540.first.field_2._M_local_buf[9] = 'd';
  local_540.first.field_2._M_local_buf[10] = 'r';
  local_540.first.field_2._M_local_buf[0xb] = 'e';
  local_540.first.field_2._M_local_buf[0xc] = 'c';
  local_540.first.field_2._M_local_buf[0xd] = 't';
  local_540.first._M_string_length = 0xe;
  local_540.first.field_2._M_local_buf[0xe] = '\0';
  local_540.first._M_dataplus._M_p = (pointer)paVar2;
  bVar8 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                     &name_index_map,0x904f,GVar16);
  local_511 = bVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar2 = &local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_540.first.field_2._M_local_buf[6] = 'e';
  local_540.first.field_2._M_local_buf[7] = '_';
  local_540.first.field_2._M_local_buf[8] = 'b';
  local_540.first.field_2._M_local_buf[9] = 'u';
  local_540.first.field_2._M_local_buf[10] = 'f';
  local_540.first.field_2._M_local_buf[0xb] = 'f';
  local_540.first.field_2._M_local_buf[0xc] = 'e';
  local_540.first.field_2._M_local_buf[0xd] = 'r';
  local_540.first._M_string_length = 0xe;
  local_540.first.field_2._M_local_buf[0xe] = '\0';
  local_540.first._M_dataplus._M_p = (pointer)paVar2;
  bVar5 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                     &name_index_map,0x9051,GVar16);
  local_512 = bVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar2 = &local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_540.first.field_2._M_local_buf[6] = 'e';
  local_540.first.field_2._M_local_buf[7] = '_';
  local_540.first.field_2._M_local_buf[8] = '1';
  local_540.first.field_2._M_local_buf[9] = 'd';
  local_540.first.field_2._M_local_buf[10] = 'a';
  local_540.first.field_2._M_local_buf[0xb] = 'r';
  local_540.first.field_2._M_local_buf[0xc] = 'r';
  local_540.first.field_2._M_local_buf[0xd] = 'a';
  local_540.first.field_2._M_local_buf[0xe] = 'y';
  local_540.first._M_string_length = 0xf;
  local_540.first.field_2._M_local_buf[0xf] = '\0';
  local_540.first._M_dataplus._M_p = (pointer)paVar2;
  bVar7 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                     &name_index_map,0x9052,GVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  paVar2 = &local_540.first.field_2;
  local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
  local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
  local_540.first.field_2._M_local_buf[6] = 'e';
  local_540.first.field_2._M_local_buf[7] = '_';
  local_540.first.field_2._M_local_buf[8] = '2';
  local_540.first.field_2._M_local_buf[9] = 'd';
  local_540.first.field_2._M_local_buf[10] = 'a';
  local_540.first.field_2._M_local_buf[0xb] = 'r';
  local_540.first.field_2._M_local_buf[0xc] = 'r';
  local_540.first.field_2._M_local_buf[0xd] = 'a';
  local_540.first.field_2._M_local_buf[0xe] = 'y';
  local_540.first._M_string_length = 0xf;
  local_540.first.field_2._M_local_buf[0xf] = '\0';
  local_540.first._M_dataplus._M_p = (pointer)paVar2;
  bVar9 = ShaderImageLoadStoreBase::CheckUniform
                    (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                     &name_index_map,0x9053,GVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_540.first._M_dataplus._M_p,
                    CONCAT17(local_540.first.field_2._M_local_buf[7],
                             CONCAT16(local_540.first.field_2._M_local_buf[6],
                                      CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_,
                                               local_540.first.field_2._M_allocated_capacity._0_4_))
                            ) + 1);
  }
  pCVar1 = local_208;
  glu::CallLogWrapper::glUseProgram(local_208,0);
  glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar10);
  glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
  glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&name_index_map._M_t);
  if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((((bVar8 && bVar5) && bVar7) & bVar6 & local_512 & bVar4 & local_511 & bVar9) == 1) {
    local_1b8.m_data[0] = -NAN;
    local_1b8.m_data[1] = 1.4013e-44;
    local_1b8.m_data[2] = -NAN;
    local_1b8.m_data[3] = 4.2039e-42;
    local_418.m_data[0] = -NAN;
    local_418.m_data[1] = 1.4013e-44;
    local_418.m_data[2] = -NAN;
    local_418.m_data[3] = 4.2039e-42;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&name_index_map,
               "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
    local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
    local_540.first.field_2._M_local_buf[6] = 'i';
    local_540.first._M_string_length = 7;
    local_540.first.field_2._M_local_buf[7] = '\0';
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&name_index_map,local_540.first._M_dataplus._M_p,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
    name._0_8_ = name + 0x10;
    name[0x10] = 'i';
    name[0x11] = '\0';
    name[8] = '\x01';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)name._0_8_,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"image1D g_image_1d;\nlayout(",0x1b);
    local_508 = &local_4f8;
    local_500 = 7;
    local_4f8._M_allocated_capacity = 0x69323361626772;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_508->_M_local_buf,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
    textures._0_8_ = textures + 4;
    textures[4]._0_1_ = 0x69;
    textures[4]._1_1_ = 0;
    textures[2] = 1;
    textures[3] = 0;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)textures._0_8_,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"image2D g_image_2d;\nlayout(",0x1b);
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&data.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x7;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x69323361626772;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,(char *)data.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
    _buffer = &local_488;
    local_488 = 'i';
    uStack_487 = 0;
    local_490 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,_buffer,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"image3D g_image_3d;\nlayout(",0x1b);
    _uniforms = &local_428;
    local_430 = 7;
    local_428 = 0x69323361626772;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)_uniforms,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
    local_228 = &local_218;
    local_218 = 'i';
    uStack_217 = 0;
    local_220 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_228,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"image2DRect g_image_2drect;\nlayout(",0x23);
    local_3c8 = &local_3b8;
    local_3c0 = 7;
    local_3b8 = 0x69323361626772;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3c8,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
    local_248 = &local_238;
    local_238 = 'i';
    uStack_237 = 0;
    local_240 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_248,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"imageBuffer g_image_buffer;\nlayout(",0x23);
    local_3e8 = &local_3d8;
    local_3e0 = 7;
    local_3d8 = 0x69323361626772;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3e8,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
    local_268 = &local_258;
    local_258 = 'i';
    uStack_257 = 0;
    local_260 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_268,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"image1DArray g_image_1darray;\nlayout(",0x25);
    local_408 = &local_3f8;
    local_400 = 7;
    local_3f8 = 0x69323361626772;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_408,7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
    local_288 = &local_278;
    local_278 = 'i';
    uStack_277 = 0;
    local_280 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_288,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
               ,0x7c);
    local_2a8 = &local_298;
    local_298 = 'i';
    uStack_297 = 0;
    local_2a0 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2a8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ",0x39);
    local_2c8 = &local_2b8;
    local_2b8 = 'i';
    uStack_2b7 = 0;
    local_2c0 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2c8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
               ,0x56);
    local_2e8 = &local_2d8;
    local_2d8 = 'i';
    uStack_2d7 = 0;
    local_2e0 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2e8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
               ,0x62);
    local_308 = &local_2f8;
    local_2f8 = 'i';
    uStack_2f7 = 0;
    local_300 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_308,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
               ,99);
    local_328 = &local_318;
    local_318 = 'i';
    uStack_317 = 0;
    local_320 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_328,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
               ,0x59);
    local_348 = &local_338;
    local_338 = 'i';
    uStack_337 = 0;
    local_340 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_348,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
               ,0x5c);
    local_368 = &local_358;
    local_358 = 'i';
    uStack_357 = 0;
    local_360 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_368,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
               ,0x66);
    local_388 = &local_378;
    local_378 = 'i';
    uStack_377 = 0;
    local_380 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_388,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
               ,0x67);
    local_3a8 = &local_398;
    local_398 = 'i';
    uStack_397 = 0;
    local_3a0 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_3a8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
               ,100);
    local_200 = &local_1f0;
    local_1f0 = 'i';
    uStack_1ef = 0;
    local_1f8 = 1;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_200,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,
               ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
               ,0x65);
    local_1c8 = 'i';
    uStack_1c7 = 0;
    local_1d8.m_data[2] = 1.4013e-45;
    local_1d8.m_data[3] = 0.0;
    local_1d8.m_data._0_8_ = &local_1c8;
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,&local_1c8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
    poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}",0x27);
    if ((char *)local_1d8.m_data._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8.m_data._0_8_,
                      CONCAT62(uStack_1c6,CONCAT11(uStack_1c7,local_1c8)) + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
    }
    if (local_328 != &local_318) {
      operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
    }
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,local_3b8 + 1);
    }
    if (local_228 != &local_218) {
      operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
    }
    if (_uniforms != &local_428) {
      operator_delete(_uniforms,local_428 + 1);
    }
    if (_buffer != &local_488) {
      operator_delete(_buffer,CONCAT62(uStack_486,CONCAT11(uStack_487,local_488)) + 1);
    }
    if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&data.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)(data.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data + 1
                             ));
    }
    if ((GLuint *)textures._0_8_ != textures + 4) {
      operator_delete((void *)textures._0_8_,
                      CONCAT44(textures[5],
                               CONCAT22(textures[4]._2_2_,
                                        CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1);
    }
    if (local_508 != &local_4f8) {
      operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
    }
    if ((GLchar *)name._0_8_ != name + 0x10) {
      operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    p_Var3 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
    std::ios_base::~ios_base(local_138);
    GVar10 = ShaderImageLoadStoreBase::BuildProgram
                       (&local_510->super_ShaderImageLoadStoreBase,
                        "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                        ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_478.m_data._0_8_,
                        (bool *)0x0);
    if ((long *)local_478.m_data._0_8_ != local_468) {
      operator_delete((void *)local_478.m_data._0_8_,local_468[0] + 1);
    }
    glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
    glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
              ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&data,0x200,
               (value_type *)&local_1b8,(allocator_type *)&name_index_map);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde0,textures[0]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage1D
              (pCVar1,0xde0,0,0x8d82,0x10,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde0,0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,textures[1]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (pCVar1,0xde1,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x806f,textures[2]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (pCVar1,0x806f,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x806f,0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x84f5,textures[3]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x84f5,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x84f5,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (pCVar1,0x84f5,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x84f5,0);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x8c2a,0x100,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e8);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture
              (pCVar1,0x8c2a,
               CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])));
    glu::CallLogWrapper::glTexBuffer(pCVar1,0x8c2a,0x8d82,buffer);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x8c2a,0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x8c18,textures[5]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c18,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c18,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (pCVar1,0x8c18,0,0x8d82,0x10,2,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x8c18,0);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,textures[6]);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage3D
              (pCVar1,0x8c1a,0,0x8d82,0x10,0x10,2,0,0x8d99,0x1404,
               data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,0);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,0,textures[0],0,'\0',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[1],0,'\0',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[2],0,'\x01',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[3],0,'\0',0,35000,0x8d82);
    glu::CallLogWrapper::glBindImageTexture
              (pCVar1,4,CONCAT22(textures[4]._2_2_,
                                 CONCAT11(textures[4]._1_1_,(undefined1)textures[4])),0,'\0',0,35000
               ,0x8d82);
    glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[5],0,'\x01',0,35000,0x8d82);
    pvVar17 = (vec4 *)0x0;
    glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[6],0,'\x01',0,35000,0x8d82);
    glu::CallLogWrapper::glClear(pCVar1,0x4000);
    glu::CallLogWrapper::glUseProgram(pCVar1,GVar10);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_1d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,0);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,1);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_3d");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,2);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2drect");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,3);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_buffer");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,4);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_1darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,5);
    GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2darray");
    glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,6);
    glu::CallLogWrapper::glBindVertexArray(pCVar1,*local_1e0);
    iVar15 = 0x10;
    glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
    glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
    name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
    bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&local_510->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                       iVar15,pvVar17);
    GVar16 = (GLenum)pvVar17;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar10,0x8b86,&uniforms);
    if (uniforms != 7) {
      bVar4 = false;
      anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
    }
    if (uniforms != 0) {
      GVar14 = 0;
      do {
        pcVar18 = name;
        glu::CallLogWrapper::glGetActiveUniformName
                  (local_208,GVar10,GVar14,0x20,(GLsizei *)0x0,name);
        GVar16 = (GLenum)pcVar18;
        local_508 = &local_4f8;
        sVar13 = strlen(name);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,name,name + sVar13);
        local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
        local_540.first.field_2._M_allocated_capacity._0_4_ =
             (undefined4)local_4f8._M_allocated_capacity;
        local_540.first.field_2._M_local_buf[6] = (char)((ulong)local_4f8._0_8_ >> 0x30);
        local_540.first.field_2._M_local_buf[7] = (char)((ulong)local_4f8._0_8_ >> 0x38);
        local_540.first.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)local_4f8._0_8_ >> 0x20);
        if (local_508 == &local_4f8) {
          local_540.first.field_2._M_local_buf[8] = local_4f8._M_local_buf[8];
          local_540.first.field_2._M_local_buf[9] = (char)local_4f8._9_7_;
          local_540.first.field_2._M_local_buf[10] = (char)((uint7)local_4f8._9_7_ >> 8);
          local_540.first.field_2._M_local_buf[0xb] = (char)((uint7)local_4f8._9_7_ >> 0x10);
          local_540.first.field_2._M_local_buf[0xc] = (char)((uint7)local_4f8._9_7_ >> 0x18);
          local_540.first.field_2._M_local_buf[0xd] = (char)((uint7)local_4f8._9_7_ >> 0x20);
          local_540.first.field_2._M_local_buf[0xe] = (char)((uint7)local_4f8._9_7_ >> 0x28);
          local_540.first.field_2._M_local_buf[0xf] = (char)((uint7)local_4f8._9_7_ >> 0x30);
        }
        else {
          local_540.first._M_dataplus._M_p = (pointer)local_508;
        }
        local_540.first._M_string_length = local_500;
        local_500 = 0;
        local_4f8._M_allocated_capacity = local_4f8._M_allocated_capacity & 0xffffffffffffff00;
        local_540.second = GVar14;
        local_508 = &local_4f8;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                    *)&name_index_map,&local_540);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
          operator_delete(local_540.first._M_dataplus._M_p,
                          CONCAT17(local_540.first.field_2._M_local_buf[7],
                                   CONCAT16(local_540.first.field_2._M_local_buf[6],
                                            CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                     _4_2_,local_540.first.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
        if (local_508 != &local_4f8) {
          operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
        }
        GVar14 = GVar14 + 1;
      } while (GVar14 < (uint)uniforms);
    }
    paVar2 = &local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
    local_540.first.field_2._M_local_buf[6] = 'e';
    local_540.first.field_2._M_local_buf[7] = '_';
    local_540.first.field_2._M_local_buf[8] = '1';
    local_540.first.field_2._M_local_buf[9] = 'd';
    local_540.first._M_string_length = 10;
    local_540.first.field_2._M_local_buf[10] = '\0';
    local_540.first._M_dataplus._M_p = (pointer)paVar2;
    bVar5 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                       &name_index_map,0x9057,GVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    paVar2 = &local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
    local_540.first.field_2._M_local_buf[6] = 'e';
    local_540.first.field_2._M_local_buf[7] = '_';
    local_540.first.field_2._M_local_buf[8] = '2';
    local_540.first.field_2._M_local_buf[9] = 'd';
    local_540.first._M_string_length = 10;
    local_540.first.field_2._M_local_buf[10] = '\0';
    local_540.first._M_dataplus._M_p = (pointer)paVar2;
    bVar6 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                       &name_index_map,0x9058,GVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    paVar2 = &local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
    local_540.first.field_2._M_local_buf[6] = 'e';
    local_540.first.field_2._M_local_buf[7] = '_';
    local_540.first.field_2._M_local_buf[8] = '3';
    local_540.first.field_2._M_local_buf[9] = 'd';
    local_540.first._M_string_length = 10;
    local_540.first.field_2._M_local_buf[10] = '\0';
    local_540.first._M_dataplus._M_p = (pointer)paVar2;
    bVar7 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                       &name_index_map,0x9059,GVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    paVar2 = &local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
    local_540.first.field_2._M_local_buf[6] = 'e';
    local_540.first.field_2._M_local_buf[7] = '_';
    local_540.first.field_2._M_local_buf[8] = '2';
    local_540.first.field_2._M_local_buf[9] = 'd';
    local_540.first.field_2._M_local_buf[10] = 'r';
    local_540.first.field_2._M_local_buf[0xb] = 'e';
    local_540.first.field_2._M_local_buf[0xc] = 'c';
    local_540.first.field_2._M_local_buf[0xd] = 't';
    local_540.first._M_string_length = 0xe;
    local_540.first.field_2._M_local_buf[0xe] = '\0';
    local_540.first._M_dataplus._M_p = (pointer)paVar2;
    bVar8 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                       &name_index_map,0x905a,GVar16);
    local_511 = bVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    paVar2 = &local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
    local_540.first.field_2._M_local_buf[6] = 'e';
    local_540.first.field_2._M_local_buf[7] = '_';
    local_540.first.field_2._M_local_buf[8] = 'b';
    local_540.first.field_2._M_local_buf[9] = 'u';
    local_540.first.field_2._M_local_buf[10] = 'f';
    local_540.first.field_2._M_local_buf[0xb] = 'f';
    local_540.first.field_2._M_local_buf[0xc] = 'e';
    local_540.first.field_2._M_local_buf[0xd] = 'r';
    local_540.first._M_string_length = 0xe;
    local_540.first.field_2._M_local_buf[0xe] = '\0';
    local_540.first._M_dataplus._M_p = (pointer)paVar2;
    bVar5 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                       &name_index_map,0x905c,GVar16);
    local_512 = bVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    paVar2 = &local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
    local_540.first.field_2._M_local_buf[6] = 'e';
    local_540.first.field_2._M_local_buf[7] = '_';
    local_540.first.field_2._M_local_buf[8] = '1';
    local_540.first.field_2._M_local_buf[9] = 'd';
    local_540.first.field_2._M_local_buf[10] = 'a';
    local_540.first.field_2._M_local_buf[0xb] = 'r';
    local_540.first.field_2._M_local_buf[0xc] = 'r';
    local_540.first.field_2._M_local_buf[0xd] = 'a';
    local_540.first.field_2._M_local_buf[0xe] = 'y';
    local_540.first._M_string_length = 0xf;
    local_540.first.field_2._M_local_buf[0xf] = '\0';
    local_540.first._M_dataplus._M_p = (pointer)paVar2;
    bVar7 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                       &name_index_map,0x905d,GVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    paVar2 = &local_540.first.field_2;
    local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
    local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
    local_540.first.field_2._M_local_buf[6] = 'e';
    local_540.first.field_2._M_local_buf[7] = '_';
    local_540.first.field_2._M_local_buf[8] = '2';
    local_540.first.field_2._M_local_buf[9] = 'd';
    local_540.first.field_2._M_local_buf[10] = 'a';
    local_540.first.field_2._M_local_buf[0xb] = 'r';
    local_540.first.field_2._M_local_buf[0xc] = 'r';
    local_540.first.field_2._M_local_buf[0xd] = 'a';
    local_540.first.field_2._M_local_buf[0xe] = 'y';
    local_540.first._M_string_length = 0xf;
    local_540.first.field_2._M_local_buf[0xf] = '\0';
    local_540.first._M_dataplus._M_p = (pointer)paVar2;
    bVar9 = ShaderImageLoadStoreBase::CheckUniform
                      (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                       &name_index_map,0x905e,GVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540.first._M_dataplus._M_p != paVar2) {
      operator_delete(local_540.first._M_dataplus._M_p,
                      CONCAT17(local_540.first.field_2._M_local_buf[7],
                               CONCAT16(local_540.first.field_2._M_local_buf[6],
                                        CONCAT24(local_540.first.field_2._M_allocated_capacity._4_2_
                                                 ,local_540.first.field_2._M_allocated_capacity.
                                                  _0_4_))) + 1);
    }
    pCVar1 = local_208;
    glu::CallLogWrapper::glUseProgram(local_208,0);
    glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar10);
    glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
    glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&name_index_map._M_t);
    if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((((bVar8 && bVar5) && bVar7) & bVar6 & local_512 & bVar4 & local_511 & bVar9) == 1) {
      local_1b8.m_data[0] = 1.4013e-45;
      local_1b8.m_data[1] = 1.4013e-44;
      local_1b8.m_data[2] = 2.8026e-43;
      local_1b8.m_data[3] = 4.2039e-42;
      local_418.m_data[0] = 1.4013e-45;
      local_418.m_data[1] = 1.4013e-44;
      local_418.m_data[2] = 2.8026e-43;
      local_418.m_data[3] = 4.2039e-42;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&name_index_map,
                 "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
      local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
      local_540.first.field_2._M_local_buf[6] = 'u';
      local_540.first.field_2._M_local_buf[7] = 'i';
      local_540.first._M_string_length = 8;
      local_540.first.field_2._M_local_buf[8] = '\0';
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&name_index_map,local_540.first._M_dataplus._M_p,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
      name._0_8_ = name + 0x10;
      name[0x10] = 'u';
      name[0x11] = '\0';
      name[8] = '\x01';
      name[9] = '\0';
      name[10] = '\0';
      name[0xb] = '\0';
      name[0xc] = '\0';
      name[0xd] = '\0';
      name[0xe] = '\0';
      name[0xf] = '\0';
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)name._0_8_,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"image1D g_image_1d;\nlayout(",0x1b);
      local_508 = &local_4f8;
      local_4f8._M_allocated_capacity = 0x6975323361626772;
      local_500 = 8;
      local_4f8._M_local_buf[8] = '\0';
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,local_508->_M_local_buf,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
      textures._0_8_ = textures + 4;
      textures[4]._0_1_ = 0x75;
      textures[4]._1_1_ = 0;
      textures[2] = 1;
      textures[3] = 0;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)textures._0_8_,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"image2D g_image_2d;\nlayout(",0x1b);
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x6975323361626772;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x8;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)data.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
      _buffer = &local_488;
      local_488 = 'u';
      uStack_487 = 0;
      local_490 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,_buffer,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"image3D g_image_3d;\nlayout(",0x1b);
      _uniforms = &local_428;
      local_428 = 0x6975323361626772;
      local_430 = 8;
      local_420 = 0;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)_uniforms,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
      local_228 = &local_218;
      local_218 = 'u';
      uStack_217 = 0;
      local_220 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_228,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"image2DRect g_image_2drect;\nlayout(",0x23);
      local_3c8 = &local_3b8;
      local_3b8 = 0x6975323361626772;
      local_3c0 = 8;
      local_3b0 = 0;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3c8,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
      local_248 = &local_238;
      local_238 = 'u';
      uStack_237 = 0;
      local_240 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_248,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"imageBuffer g_image_buffer;\nlayout(",0x23);
      local_3e8 = &local_3d8;
      local_3d8 = 0x6975323361626772;
      local_3e0 = 8;
      local_3d0 = 0;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3e8,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
      local_268 = &local_258;
      local_258 = 'u';
      uStack_257 = 0;
      local_260 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_268,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"image1DArray g_image_1darray;\nlayout(",0x25);
      local_408 = &local_3f8;
      local_3f8 = 0x6975323361626772;
      local_400 = 8;
      local_3f0 = 0;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_408,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
      local_288 = &local_278;
      local_278 = 'u';
      uStack_277 = 0;
      local_280 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_288,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 "image2DArray g_image_2darray;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                 ,0x7c);
      local_2a8 = &local_298;
      local_298 = 'u';
      uStack_297 = 0;
      local_2a0 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2a8,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"vec4 v;\n  v = imageLoad(g_image_1d, coord.x);\n  if (v != ",0x39);
      local_2c8 = &local_2b8;
      local_2b8 = 'u';
      uStack_2b7 = 0;
      local_2c0 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2c8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_2d, coord);\n  if (v != "
                 ,0x56);
      local_2e8 = &local_2d8;
      local_2d8 = 'u';
      uStack_2d7 = 0;
      local_2e0 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2e8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 0));\n  if (v != "
                 ,0x62);
      local_308 = &local_2f8;
      local_2f8 = 'u';
      uStack_2f7 = 0;
      local_300 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_308,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_3d, ivec3(coord.xy, 1));\n  if (v != "
                 ,99);
      local_328 = &local_318;
      local_318 = 'u';
      uStack_317 = 0;
      local_320 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_328,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != "
                 ,0x59);
      local_348 = &local_338;
      local_338 = 'u';
      uStack_337 = 0;
      local_340 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_348,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_buffer, coord.x);\n  if (v != "
                 ,0x5c);
      local_368 = &local_358;
      local_358 = 'u';
      uStack_357 = 0;
      local_360 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_368,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 0));\n  if (v != "
                 ,0x66);
      local_388 = &local_378;
      local_378 = 'u';
      uStack_377 = 0;
      local_380 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_388,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.65);\n  v = imageLoad(g_image_1darray, ivec2(coord.x, 1));\n  if (v != "
                 ,0x67);
      local_3a8 = &local_398;
      local_398 = 'u';
      uStack_397 = 0;
      local_3a0 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_3a8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.7);\n  v = imageLoad(g_image_2darray, ivec3(coord, 0));\n  if (v != "
                 ,100);
      local_200 = &local_1f0;
      local_1f0 = 'u';
      uStack_1ef = 0;
      local_1f8 = 1;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_200,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,
                 ") o_color = vec4(1.0, 0.0, 0.0, 0.75);\n  v = imageLoad(g_image_2darray, ivec3(coord, 1));\n  if (v != "
                 ,0x65);
      local_1c8 = 'u';
      uStack_1c7 = 0;
      local_1d8.m_data[2] = 1.4013e-45;
      local_1d8.m_data[3] = 0.0;
      local_1d8.m_data._0_8_ = &local_1c8;
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,&local_1c8,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
      poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.8);\n}",0x27);
      if ((char *)local_1d8.m_data._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8.m_data._0_8_,
                        CONCAT62(uStack_1c6,CONCAT11(uStack_1c7,local_1c8)) + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
      }
      if (local_3a8 != &local_398) {
        operator_delete(local_3a8,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
      }
      if (local_388 != &local_378) {
        operator_delete(local_388,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
      }
      if (local_368 != &local_358) {
        operator_delete(local_368,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
      }
      if (local_348 != &local_338) {
        operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
      }
      if (local_408 != &local_3f8) {
        operator_delete(local_408,local_3f8 + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
      }
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8 + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
      }
      if (_uniforms != &local_428) {
        operator_delete(_uniforms,local_428 + 1);
      }
      if (_buffer != &local_488) {
        operator_delete(_buffer,CONCAT62(uStack_486,CONCAT11(uStack_487,local_488)) + 1);
      }
      if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pointer)&data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)(data.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data +
                               1));
      }
      if ((GLuint *)textures._0_8_ != textures + 4) {
        operator_delete((void *)textures._0_8_,
                        CONCAT44(textures[5],
                                 CONCAT22(textures[4]._2_2_,
                                          CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) + 1)
        ;
      }
      if (local_508 != &local_4f8) {
        operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
      }
      if ((GLchar *)name._0_8_ != name + 0x10) {
        operator_delete((void *)name._0_8_,CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      p_Var3 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
      std::ios_base::~ios_base(local_138);
      GVar10 = ShaderImageLoadStoreBase::BuildProgram
                         (&local_510->super_ShaderImageLoadStoreBase,
                          "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                          ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)local_478.m_data._0_8_,
                          (bool *)0x0);
      if ((long *)local_478.m_data._0_8_ != local_468) {
        operator_delete((void *)local_478.m_data._0_8_,local_468[0] + 1);
      }
      glu::CallLogWrapper::glGenTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glGenBuffers(pCVar1,1,&buffer);
      std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )&data,0x200,(value_type *)&local_1b8,(allocator_type *)&name_index_map);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde0,textures[0]);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde0,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage1D
                (pCVar1,0xde0,0,0x8d70,0x10,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde0,0);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,textures[1]);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D
                (pCVar1,0xde1,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(pCVar1,0xde1,0);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x806f,textures[2]);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x806f,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage3D
                (pCVar1,0x806f,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x806f,0);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x84f5,textures[3]);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x84f5,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x84f5,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D
                (pCVar1,0x84f5,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x84f5,0);
      glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,buffer);
      glu::CallLogWrapper::glBufferData
                (pCVar1,0x8c2a,0x100,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x88e8);
      glu::CallLogWrapper::glBindBuffer(pCVar1,0x8c2a,0);
      glu::CallLogWrapper::glBindTexture
                (pCVar1,0x8c2a,
                 CONCAT22(textures[4]._2_2_,CONCAT11(textures[4]._1_1_,(undefined1)textures[4])));
      glu::CallLogWrapper::glTexBuffer(pCVar1,0x8c2a,0x8d70,buffer);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x8c2a,0);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x8c18,textures[5]);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c18,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c18,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage2D
                (pCVar1,0x8c18,0,0x8d70,0x10,2,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x8c18,0);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,textures[6]);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2800,0x2600);
      glu::CallLogWrapper::glTexImage3D
                (pCVar1,0x8c1a,0,0x8d70,0x10,0x10,2,0,0x8d99,0x1405,
                 data.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,0);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,0,textures[0],0,'\0',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,1,textures[1],0,'\0',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,2,textures[2],0,'\x01',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,3,textures[3],0,'\0',0,35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture
                (pCVar1,4,CONCAT22(textures[4]._2_2_,
                                   CONCAT11(textures[4]._1_1_,(undefined1)textures[4])),0,'\0',0,
                 35000,0x8d70);
      glu::CallLogWrapper::glBindImageTexture(pCVar1,5,textures[5],0,'\x01',0,35000,0x8d70);
      pvVar17 = (vec4 *)0x0;
      glu::CallLogWrapper::glBindImageTexture(pCVar1,6,textures[6],0,'\x01',0,35000,0x8d70);
      glu::CallLogWrapper::glClear(pCVar1,0x4000);
      glu::CallLogWrapper::glUseProgram(pCVar1,GVar10);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_1d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,0);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,1);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_3d");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,2);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2drect");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,3);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_buffer");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,4);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_1darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,5);
      GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_2darray");
      glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,6);
      glu::CallLogWrapper::glBindVertexArray(pCVar1,*local_1e0);
      iVar15 = 0x10;
      glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
      glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
      name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
      bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                        (&local_510->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map,
                         iVar15,pvVar17);
      GVar16 = (GLenum)pvVar17;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar10,0x8b86,&uniforms);
      if (uniforms != 7) {
        bVar4 = false;
        anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 7.\n");
      }
      if (uniforms != 0) {
        GVar14 = 0;
        do {
          pcVar18 = name;
          glu::CallLogWrapper::glGetActiveUniformName
                    (local_208,GVar10,GVar14,0x20,(GLsizei *)0x0,name);
          GVar16 = (GLenum)pcVar18;
          local_508 = &local_4f8;
          sVar13 = strlen(name);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,name,name + sVar13);
          local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
          local_540.first.field_2._M_allocated_capacity._0_4_ =
               (undefined4)local_4f8._M_allocated_capacity;
          local_540.first.field_2._M_local_buf[6] = (char)((ulong)local_4f8._0_8_ >> 0x30);
          local_540.first.field_2._M_local_buf[7] = (char)((ulong)local_4f8._0_8_ >> 0x38);
          local_540.first.field_2._M_allocated_capacity._4_2_ =
               (undefined2)((ulong)local_4f8._0_8_ >> 0x20);
          if (local_508 == &local_4f8) {
            local_540.first.field_2._M_local_buf[8] = local_4f8._M_local_buf[8];
            local_540.first.field_2._M_local_buf[9] = (char)local_4f8._9_7_;
            local_540.first.field_2._M_local_buf[10] = (char)((uint7)local_4f8._9_7_ >> 8);
            local_540.first.field_2._M_local_buf[0xb] = (char)((uint7)local_4f8._9_7_ >> 0x10);
            local_540.first.field_2._M_local_buf[0xc] = (char)((uint7)local_4f8._9_7_ >> 0x18);
            local_540.first.field_2._M_local_buf[0xd] = (char)((uint7)local_4f8._9_7_ >> 0x20);
            local_540.first.field_2._M_local_buf[0xe] = (char)((uint7)local_4f8._9_7_ >> 0x28);
            local_540.first.field_2._M_local_buf[0xf] = (char)((uint7)local_4f8._9_7_ >> 0x30);
          }
          else {
            local_540.first._M_dataplus._M_p = (pointer)local_508;
          }
          local_540.first._M_string_length = local_500;
          local_500 = 0;
          local_4f8._M_allocated_capacity = local_4f8._M_allocated_capacity & 0xffffffffffffff00;
          local_540.second = GVar14;
          local_508 = &local_4f8;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                      *)&name_index_map,&local_540);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
            operator_delete(local_540.first._M_dataplus._M_p,
                            CONCAT17(local_540.first.field_2._M_local_buf[7],
                                     CONCAT16(local_540.first.field_2._M_local_buf[6],
                                              CONCAT24(local_540.first.field_2._M_allocated_capacity
                                                       ._4_2_,local_540.first.field_2.
                                                              _M_allocated_capacity._0_4_))) + 1);
          }
          if (local_508 != &local_4f8) {
            operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
          }
          GVar14 = GVar14 + 1;
        } while (GVar14 < (uint)uniforms);
      }
      paVar2 = &local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
      local_540.first.field_2._M_local_buf[6] = 'e';
      local_540.first.field_2._M_local_buf[7] = '_';
      local_540.first.field_2._M_local_buf[8] = '1';
      local_540.first.field_2._M_local_buf[9] = 'd';
      local_540.first._M_string_length = 10;
      local_540.first.field_2._M_local_buf[10] = '\0';
      local_540.first._M_dataplus._M_p = (pointer)paVar2;
      bVar5 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                         &name_index_map,0x9062,GVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      paVar2 = &local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
      local_540.first.field_2._M_local_buf[6] = 'e';
      local_540.first.field_2._M_local_buf[7] = '_';
      local_540.first.field_2._M_local_buf[8] = '2';
      local_540.first.field_2._M_local_buf[9] = 'd';
      local_540.first._M_string_length = 10;
      local_540.first.field_2._M_local_buf[10] = '\0';
      local_540.first._M_dataplus._M_p = (pointer)paVar2;
      bVar6 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                         &name_index_map,0x9063,GVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      paVar2 = &local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
      local_540.first.field_2._M_local_buf[6] = 'e';
      local_540.first.field_2._M_local_buf[7] = '_';
      local_540.first.field_2._M_local_buf[8] = '3';
      local_540.first.field_2._M_local_buf[9] = 'd';
      local_540.first._M_string_length = 10;
      local_540.first.field_2._M_local_buf[10] = '\0';
      local_540.first._M_dataplus._M_p = (pointer)paVar2;
      bVar7 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                         &name_index_map,0x9064,GVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      paVar2 = &local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
      local_540.first.field_2._M_local_buf[6] = 'e';
      local_540.first.field_2._M_local_buf[7] = '_';
      local_540.first.field_2._M_local_buf[8] = '2';
      local_540.first.field_2._M_local_buf[9] = 'd';
      local_540.first.field_2._M_local_buf[10] = 'r';
      local_540.first.field_2._M_local_buf[0xb] = 'e';
      local_540.first.field_2._M_local_buf[0xc] = 'c';
      local_540.first.field_2._M_local_buf[0xd] = 't';
      local_540.first._M_string_length = 0xe;
      local_540.first.field_2._M_local_buf[0xe] = '\0';
      local_540.first._M_dataplus._M_p = (pointer)paVar2;
      bVar8 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                         &name_index_map,0x9065,GVar16);
      local_511 = bVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      paVar2 = &local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
      local_540.first.field_2._M_local_buf[6] = 'e';
      local_540.first.field_2._M_local_buf[7] = '_';
      local_540.first.field_2._M_local_buf[8] = 'b';
      local_540.first.field_2._M_local_buf[9] = 'u';
      local_540.first.field_2._M_local_buf[10] = 'f';
      local_540.first.field_2._M_local_buf[0xb] = 'f';
      local_540.first.field_2._M_local_buf[0xc] = 'e';
      local_540.first.field_2._M_local_buf[0xd] = 'r';
      local_540.first._M_string_length = 0xe;
      local_540.first.field_2._M_local_buf[0xe] = '\0';
      local_540.first._M_dataplus._M_p = (pointer)paVar2;
      bVar5 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                         &name_index_map,0x9067,GVar16);
      local_512 = bVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      paVar2 = &local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
      local_540.first.field_2._M_local_buf[6] = 'e';
      local_540.first.field_2._M_local_buf[7] = '_';
      local_540.first.field_2._M_local_buf[8] = '1';
      local_540.first.field_2._M_local_buf[9] = 'd';
      local_540.first.field_2._M_local_buf[10] = 'a';
      local_540.first.field_2._M_local_buf[0xb] = 'r';
      local_540.first.field_2._M_local_buf[0xc] = 'r';
      local_540.first.field_2._M_local_buf[0xd] = 'a';
      local_540.first.field_2._M_local_buf[0xe] = 'y';
      local_540.first._M_string_length = 0xf;
      local_540.first.field_2._M_local_buf[0xf] = '\0';
      local_540.first._M_dataplus._M_p = (pointer)paVar2;
      bVar7 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                         &name_index_map,0x9068,GVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      paVar2 = &local_540.first.field_2;
      local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
      local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
      local_540.first.field_2._M_local_buf[6] = 'e';
      local_540.first.field_2._M_local_buf[7] = '_';
      local_540.first.field_2._M_local_buf[8] = '2';
      local_540.first.field_2._M_local_buf[9] = 'd';
      local_540.first.field_2._M_local_buf[10] = 'a';
      local_540.first.field_2._M_local_buf[0xb] = 'r';
      local_540.first.field_2._M_local_buf[0xc] = 'r';
      local_540.first.field_2._M_local_buf[0xd] = 'a';
      local_540.first.field_2._M_local_buf[0xe] = 'y';
      local_540.first._M_string_length = 0xf;
      local_540.first.field_2._M_local_buf[0xf] = '\0';
      local_540.first._M_dataplus._M_p = (pointer)paVar2;
      bVar9 = ShaderImageLoadStoreBase::CheckUniform
                        (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                         &name_index_map,0x9069,GVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_540.first._M_dataplus._M_p,
                        CONCAT17(local_540.first.field_2._M_local_buf[7],
                                 CONCAT16(local_540.first.field_2._M_local_buf[6],
                                          CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                   _4_2_,local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
      }
      pCVar1 = local_208;
      glu::CallLogWrapper::glUseProgram(local_208,0);
      glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar10);
      glu::CallLogWrapper::glDeleteTextures(pCVar1,7,textures);
      glu::CallLogWrapper::glDeleteBuffers(pCVar1,1,&buffer);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~_Rb_tree(&name_index_map._M_t);
      if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((((bVar8 && bVar5) && bVar7) & bVar6 & local_512 & bVar4 & local_511 & bVar9) == 1) {
        local_1d8.m_data[0] = -1.0;
        local_1d8.m_data[1] = 10.0;
        local_1d8.m_data[2] = -200.0;
        local_1d8.m_data[3] = 3000.0;
        local_478.m_data[0] = -1.0;
        local_478.m_data[1] = 10.0;
        local_478.m_data[2] = -200.0;
        local_478.m_data[3] = 3000.0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&name_index_map,
                   "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
        local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
        local_540.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
        local_540.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
        local_540.first.field_2._M_local_buf[6] = 'f';
        local_540.first._M_string_length = 7;
        local_540.first.field_2._M_local_buf[7] = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&name_index_map,local_540.first._M_dataplus._M_p,7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
        name._0_8_ = name + 0x10;
        name[8] = '\0';
        name[9] = '\0';
        name[10] = '\0';
        name[0xb] = '\0';
        name[0xc] = '\0';
        name[0xd] = '\0';
        name[0xe] = '\0';
        name[0xf] = '\0';
        name[0x10] = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)name._0_8_,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"imageCube g_image_cube;\nlayout(",0x1f);
        local_508 = &local_4f8;
        local_500 = 7;
        local_4f8._M_allocated_capacity = 0x66323361626772;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_508->_M_local_buf,7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
        textures._0_8_ = textures + 4;
        textures[2] = 0;
        textures[3] = 0;
        textures[4]._0_1_ = 0;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(char *)textures._0_8_,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                   ,0x81);
        data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)&data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage &
                      0xffffffffffffff00);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(char *)data.
                                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ",
                   0x43);
        _buffer = &local_488;
        local_490 = 0;
        local_488 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,_buffer,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
                   ,0x61);
        _uniforms = &local_428;
        local_430 = 0;
        local_428 = local_428 & 0xffffffffffffff00;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)_uniforms,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
                   ,0x62);
        local_228 = &local_218;
        local_220 = 0;
        local_218 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_228,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
                   ,0x61);
        local_3c8 = &local_3b8;
        local_3c0 = 0;
        local_3b8 = local_3b8 & 0xffffffffffffff00;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3c8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
                   ,0x62);
        local_248 = &local_238;
        local_240 = 0;
        local_238 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_248,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
                   ,0x61);
        local_3e8 = &local_3d8;
        local_3e0 = 0;
        local_3d8 = local_3d8 & 0xffffffffffffff00;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3e8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
                   ,0x68);
        local_268 = &local_258;
        local_260 = 0;
        local_258 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_268,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
                   ,0x68);
        local_408 = &local_3f8;
        local_400 = 0;
        local_3f8 = local_3f8 & 0xffffffffffffff00;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_408,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
                   ,0x67);
        local_288 = &local_278;
        local_280 = 0;
        local_278 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_288,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
                   ,0x68);
        local_2a8 = &local_298;
        local_2a0 = 0;
        local_298 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2a8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
                   ,0x67);
        local_2c8 = &local_2b8;
        local_2c0 = 0;
        local_2b8 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2c8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
                   ,0x68);
        local_2e8 = &local_2d8;
        local_2e0 = 0;
        local_2d8 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2e8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
                   ,0x67);
        local_308 = &local_2f8;
        local_300 = 0;
        local_2f8 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_308,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
                   ,0x68);
        local_328 = &local_318;
        local_320 = 0;
        local_318 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_328,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
                   ,0x67);
        local_348 = &local_338;
        local_340 = 0;
        local_338 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_348,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
                   ,0x68);
        local_368 = &local_358;
        local_360 = 0;
        local_358 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_368,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
                   ,0x68);
        local_388 = &local_378;
        local_380 = 0;
        local_378 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_388,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,
                   ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
                   ,0x69);
        local_3a8 = &local_398;
        local_3a0 = 0;
        local_398 = '\0';
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_3a8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
        poVar12 = tcu::operator<<(poVar12,&local_478);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}",0x27);
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
        }
        if (local_328 != &local_318) {
          operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
        }
        if (local_2e8 != &local_2d8) {
          operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
        }
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
        }
        if (local_288 != &local_278) {
          operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
        }
        if (local_408 != &local_3f8) {
          operator_delete(local_408,local_3f8 + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
        }
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8,local_3d8 + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_228 != &local_218) {
          operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
        }
        if (_uniforms != &local_428) {
          operator_delete(_uniforms,local_428 + 1);
        }
        if (_buffer != &local_488) {
          operator_delete(_buffer,CONCAT62(uStack_486,CONCAT11(uStack_487,local_488)) + 1);
        }
        if (data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)&data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)(data.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data
                                 + 1));
        }
        if ((GLuint *)textures._0_8_ != textures + 4) {
          operator_delete((void *)textures._0_8_,
                          CONCAT44(textures[5],
                                   CONCAT22(textures[4]._2_2_,
                                            CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) +
                          1);
        }
        if (local_508 != &local_4f8) {
          operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
        }
        if ((GLchar *)name._0_8_ != name + 0x10) {
          operator_delete((void *)name._0_8_,
                          CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
          operator_delete(local_540.first._M_dataplus._M_p,
                          CONCAT17(local_540.first.field_2._M_local_buf[7],
                                   CONCAT16(local_540.first.field_2._M_local_buf[6],
                                            CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                     _4_2_,local_540.first.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
        p_Var3 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
        std::ios_base::~ios_base(local_138);
        GVar10 = ShaderImageLoadStoreBase::BuildProgram
                           (&local_510->super_ShaderImageLoadStoreBase,
                            "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                            ,(char *)0x0,(char *)0x0,(char *)0x0,local_200,(bool *)0x0);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
        }
        glu::CallLogWrapper::glGenTextures(pCVar1,2,(GLuint *)&data);
        std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                  ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                   textures,0xc00,&local_1d8,(allocator_type *)&name_index_map);
        glu::CallLogWrapper::glBindTexture
                  (pCVar1,0x8513,
                   (GLuint)data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2800,0x2600);
        glu::CallLogWrapper::glTexImage2D
                  (pCVar1,0x8516,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
        glu::CallLogWrapper::glTexImage2D
                  (pCVar1,0x8515,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
        glu::CallLogWrapper::glTexImage2D
                  (pCVar1,0x8518,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
        glu::CallLogWrapper::glTexImage2D
                  (pCVar1,0x8517,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
        glu::CallLogWrapper::glTexImage2D
                  (pCVar1,0x851a,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
        glu::CallLogWrapper::glTexImage2D
                  (pCVar1,0x8519,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)textures._0_8_);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x8513,0);
        glu::CallLogWrapper::glBindTexture
                  (pCVar1,0x9009,
                   data.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_);
        glu::CallLogWrapper::glTexParameteri(pCVar1,0x9009,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(pCVar1,0x9009,0x2800,0x2600);
        glu::CallLogWrapper::glTexImage3D
                  (pCVar1,0x9009,0,0x8814,0x10,0x10,0xc,0,0x1908,0x1406,(void *)textures._0_8_);
        glu::CallLogWrapper::glBindTexture(pCVar1,0x9009,0);
        glu::CallLogWrapper::glBindImageTexture
                  (pCVar1,0,(GLuint)data.
                                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,
                   0x8814);
        pvVar17 = (vec4 *)0x0;
        glu::CallLogWrapper::glBindImageTexture
                  (pCVar1,1,data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,0x8814)
        ;
        glu::CallLogWrapper::glClear(pCVar1,0x4000);
        glu::CallLogWrapper::glUseProgram(pCVar1,GVar10);
        GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_cube");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,0);
        GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_cube_array");
        glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,1);
        glu::CallLogWrapper::glBindVertexArray(pCVar1,*local_1e0);
        iVar15 = 0x10;
        glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
        glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
        name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
        bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                          (&local_510->super_ShaderImageLoadStoreBase,0x10,0x10,(int)&name_index_map
                           ,iVar15,pvVar17);
        GVar16 = (GLenum)pvVar17;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
        name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
        glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar10,0x8b86,(GLint *)&buffer);
        if (buffer != 2) {
          bVar4 = false;
          anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
        }
        if (buffer != 0) {
          GVar14 = 0;
          do {
            pcVar18 = name;
            glu::CallLogWrapper::glGetActiveUniformName
                      (local_208,GVar10,GVar14,0x20,(GLsizei *)0x0,name);
            GVar16 = (GLenum)pcVar18;
            local_508 = &local_4f8;
            sVar13 = strlen(name);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,name,name + sVar13)
            ;
            local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
            local_540.first.field_2._M_allocated_capacity._0_4_ =
                 (undefined4)local_4f8._M_allocated_capacity;
            local_540.first.field_2._M_local_buf[6] = (char)((ulong)local_4f8._0_8_ >> 0x30);
            local_540.first.field_2._M_local_buf[7] = (char)((ulong)local_4f8._0_8_ >> 0x38);
            local_540.first.field_2._M_allocated_capacity._4_2_ =
                 (undefined2)((ulong)local_4f8._0_8_ >> 0x20);
            if (local_508 == &local_4f8) {
              local_540.first.field_2._M_local_buf[8] = local_4f8._M_local_buf[8];
              local_540.first.field_2._M_local_buf[9] = (char)local_4f8._9_7_;
              local_540.first.field_2._M_local_buf[10] = (char)((uint7)local_4f8._9_7_ >> 8);
              local_540.first.field_2._M_local_buf[0xb] = (char)((uint7)local_4f8._9_7_ >> 0x10);
              local_540.first.field_2._M_local_buf[0xc] = (char)((uint7)local_4f8._9_7_ >> 0x18);
              local_540.first.field_2._M_local_buf[0xd] = (char)((uint7)local_4f8._9_7_ >> 0x20);
              local_540.first.field_2._M_local_buf[0xe] = (char)((uint7)local_4f8._9_7_ >> 0x28);
              local_540.first.field_2._M_local_buf[0xf] = (char)((uint7)local_4f8._9_7_ >> 0x30);
            }
            else {
              local_540.first._M_dataplus._M_p = (pointer)local_508;
            }
            local_540.first._M_string_length = local_500;
            local_500 = 0;
            local_4f8._M_allocated_capacity = local_4f8._M_allocated_capacity & 0xffffffffffffff00;
            local_540.second = GVar14;
            local_508 = &local_4f8;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                        *)&name_index_map,&local_540);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
              operator_delete(local_540.first._M_dataplus._M_p,
                              CONCAT17(local_540.first.field_2._M_local_buf[7],
                                       CONCAT16(local_540.first.field_2._M_local_buf[6],
                                                CONCAT24(local_540.first.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            if (local_508 != &local_4f8) {
              operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
            }
            GVar14 = GVar14 + 1;
          } while (GVar14 < buffer);
        }
        paVar2 = &local_540.first.field_2;
        local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
        local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
        local_540.first.field_2._M_local_buf[6] = 'e';
        local_540.first.field_2._M_local_buf[7] = '_';
        local_540.first.field_2._M_local_buf[8] = 'c';
        local_540.first.field_2._M_local_buf[9] = 'u';
        local_540.first.field_2._M_local_buf[10] = 'b';
        local_540.first.field_2._M_local_buf[0xb] = 'e';
        local_540.first._M_string_length = 0xc;
        local_540.first.field_2._M_local_buf[0xc] = '\0';
        local_540.first._M_dataplus._M_p = (pointer)paVar2;
        bVar5 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                           &name_index_map,0x9050,GVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540.first._M_dataplus._M_p != paVar2) {
          operator_delete(local_540.first._M_dataplus._M_p,
                          CONCAT17(local_540.first.field_2._M_local_buf[7],
                                   CONCAT16(local_540.first.field_2._M_local_buf[6],
                                            CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                     _4_2_,local_540.first.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
        local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
        name[0] = '\x12';
        name[1] = '\0';
        name[2] = '\0';
        name[3] = '\0';
        name[4] = '\0';
        name[5] = '\0';
        name[6] = '\0';
        name[7] = '\0';
        local_540.first._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_540,(ulong)name);
        pCVar1 = local_208;
        local_540.first.field_2._M_allocated_capacity._0_4_ = (undefined4)name._0_8_;
        local_540.first.field_2._M_allocated_capacity._4_2_ = SUB82(name._0_8_,4);
        local_540.first.field_2._M_local_buf[6] = SUB81(name._0_8_,6);
        local_540.first.field_2._M_local_buf[7] = SUB81(name._0_8_,7);
        builtin_strncpy(local_540.first._M_dataplus._M_p,"g_image_cube_array",0x12);
        local_540.first._M_string_length._0_1_ = name[0];
        local_540.first._M_string_length._1_1_ = name[1];
        local_540.first._M_string_length._2_1_ = name[2];
        local_540.first._M_string_length._3_1_ = name[3];
        local_540.first._M_string_length._4_1_ = name[4];
        local_540.first._M_string_length._5_1_ = name[5];
        local_540.first._M_string_length._6_1_ = name[6];
        local_540.first._M_string_length._7_1_ = name[7];
        local_540.first._M_dataplus._M_p[name._0_8_] = '\0';
        bVar6 = ShaderImageLoadStoreBase::CheckUniform
                          (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                           &name_index_map,0x9054,GVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
          operator_delete(local_540.first._M_dataplus._M_p,
                          CONCAT17(local_540.first.field_2._M_local_buf[7],
                                   CONCAT16(local_540.first.field_2._M_local_buf[6],
                                            CONCAT24(local_540.first.field_2._M_allocated_capacity.
                                                     _4_2_,local_540.first.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
        }
        glu::CallLogWrapper::glUseProgram(pCVar1,0);
        glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar10);
        glu::CallLogWrapper::glDeleteTextures(pCVar1,2,(GLuint *)&data);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~_Rb_tree(&name_index_map._M_t);
        if (textures._0_8_ != 0) {
          operator_delete((void *)textures._0_8_,
                          CONCAT44(textures[5],
                                   CONCAT22(textures[4]._2_2_,
                                            CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))) -
                          textures._0_8_);
        }
        if ((bVar4 & bVar5 & bVar6) == 1) {
          local_1d8.m_data[0] = -NAN;
          local_1d8.m_data[1] = 1.4013e-44;
          local_1d8.m_data[2] = -NAN;
          local_1d8.m_data[3] = 4.2039e-42;
          local_478.m_data[0] = -NAN;
          local_478.m_data[1] = 1.4013e-44;
          local_478.m_data[2] = -NAN;
          local_478.m_data[3] = 4.2039e-42;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&name_index_map,
                     "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
          local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
          local_540.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
          local_540.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
          local_540.first.field_2._M_local_buf[6] = 'i';
          local_540.first._M_string_length = 7;
          local_540.first.field_2._M_local_buf[7] = '\0';
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&name_index_map,local_540.first._M_dataplus._M_p,7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
          name._0_8_ = name + 0x10;
          name[0x10] = 'i';
          name[0x11] = '\0';
          name[8] = '\x01';
          name[9] = '\0';
          name[10] = '\0';
          name[0xb] = '\0';
          name[0xc] = '\0';
          name[0xd] = '\0';
          name[0xe] = '\0';
          name[0xf] = '\0';
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)name._0_8_,1)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"imageCube g_image_cube;\nlayout(",0x1f);
          local_508 = &local_4f8;
          local_500 = 7;
          local_4f8._M_allocated_capacity = 0x69323361626772;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_508->_M_local_buf,7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
          textures._0_8_ = textures + 4;
          textures[4]._0_1_ = 0x69;
          textures[4]._1_1_ = 0;
          textures[2] = 1;
          textures[3] = 0;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)textures._0_8_,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                     ,0x81);
          data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)&data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT62(data.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,0x69);
          data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(char *)data.
                                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != "
                     ,0x43);
          _buffer = &local_488;
          local_488 = 'i';
          uStack_487 = 0;
          local_490 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,_buffer,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
                     ,0x61);
          _uniforms = &local_428;
          local_428 = CONCAT62(local_428._2_6_,0x69);
          local_430 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)_uniforms,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
                     ,0x62);
          local_228 = &local_218;
          local_218 = 'i';
          uStack_217 = 0;
          local_220 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_228,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
                     ,0x61);
          local_3c8 = &local_3b8;
          local_3b8 = CONCAT62(local_3b8._2_6_,0x69);
          local_3c0 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3c8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
                     ,0x62);
          local_248 = &local_238;
          local_238 = 'i';
          uStack_237 = 0;
          local_240 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_248,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
                     ,0x61);
          local_3e8 = &local_3d8;
          local_3d8 = CONCAT62(local_3d8._2_6_,0x69);
          local_3e0 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_3e8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
                     ,0x68);
          local_268 = &local_258;
          local_258 = 'i';
          uStack_257 = 0;
          local_260 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_268,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
                     ,0x68);
          local_408 = &local_3f8;
          local_3f8 = CONCAT62(local_3f8._2_6_,0x69);
          local_400 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)local_408,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
                     ,0x67);
          local_288 = &local_278;
          local_278 = 'i';
          uStack_277 = 0;
          local_280 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_288,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
                     ,0x68);
          local_2a8 = &local_298;
          local_298 = 'i';
          uStack_297 = 0;
          local_2a0 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2a8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
                     ,0x67);
          local_2c8 = &local_2b8;
          local_2b8 = 'i';
          uStack_2b7 = 0;
          local_2c0 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2c8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
                     ,0x68);
          local_2e8 = &local_2d8;
          local_2d8 = 'i';
          uStack_2d7 = 0;
          local_2e0 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2e8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
                     ,0x67);
          local_308 = &local_2f8;
          local_2f8 = 'i';
          uStack_2f7 = 0;
          local_300 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_308,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
                     ,0x68);
          local_328 = &local_318;
          local_318 = 'i';
          uStack_317 = 0;
          local_320 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_328,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
                     ,0x67);
          local_348 = &local_338;
          local_338 = 'i';
          uStack_337 = 0;
          local_340 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_348,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
                     ,0x68);
          local_368 = &local_358;
          local_358 = 'i';
          uStack_357 = 0;
          local_360 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_368,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
                     ,0x68);
          local_388 = &local_378;
          local_378 = 'i';
          uStack_377 = 0;
          local_380 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_388,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
                     ,0x69);
          local_3a8 = &local_398;
          local_398 = 'i';
          uStack_397 = 0;
          local_3a0 = 1;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_3a8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
          poVar12 = tcu::operator<<(poVar12,(Vector<int,_4> *)&local_478);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}",0x27);
          if (local_3a8 != &local_398) {
            operator_delete(local_3a8,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
          }
          if (local_388 != &local_378) {
            operator_delete(local_388,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
          }
          if (local_368 != &local_358) {
            operator_delete(local_368,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
          }
          if (local_348 != &local_338) {
            operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
          }
          if (local_328 != &local_318) {
            operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
          }
          if (local_308 != &local_2f8) {
            operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
          }
          if (local_2e8 != &local_2d8) {
            operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
          }
          if (local_2c8 != &local_2b8) {
            operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
          }
          if (local_2a8 != &local_298) {
            operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
          }
          if (local_288 != &local_278) {
            operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
          }
          if (local_408 != &local_3f8) {
            operator_delete(local_408,local_3f8 + 1);
          }
          if (local_268 != &local_258) {
            operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
          }
          if (local_3e8 != &local_3d8) {
            operator_delete(local_3e8,local_3d8 + 1);
          }
          if (local_248 != &local_238) {
            operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
          }
          if (local_3c8 != &local_3b8) {
            operator_delete(local_3c8,local_3b8 + 1);
          }
          if (local_228 != &local_218) {
            operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
          }
          if (_uniforms != &local_428) {
            operator_delete(_uniforms,local_428 + 1);
          }
          if (_buffer != &local_488) {
            operator_delete(_buffer,CONCAT62(uStack_486,CONCAT11(uStack_487,local_488)) + 1);
          }
          if (data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              (pointer)&data.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(data.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)(data.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          m_data + 1));
          }
          if ((GLuint *)textures._0_8_ != textures + 4) {
            operator_delete((void *)textures._0_8_,
                            CONCAT44(textures[5],
                                     CONCAT22(textures[4]._2_2_,
                                              CONCAT11(textures[4]._1_1_,(undefined1)textures[4])))
                            + 1);
          }
          if (local_508 != &local_4f8) {
            operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
          }
          if ((GLchar *)name._0_8_ != name + 0x10) {
            operator_delete((void *)name._0_8_,
                            CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
            operator_delete(local_540.first._M_dataplus._M_p,
                            CONCAT17(local_540.first.field_2._M_local_buf[7],
                                     CONCAT16(local_540.first.field_2._M_local_buf[6],
                                              CONCAT24(local_540.first.field_2._M_allocated_capacity
                                                       ._4_2_,local_540.first.field_2.
                                                              _M_allocated_capacity._0_4_))) + 1);
          }
          p_Var3 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
          std::ios_base::~ios_base(local_138);
          GVar10 = ShaderImageLoadStoreBase::BuildProgram
                             (&local_510->super_ShaderImageLoadStoreBase,
                              "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                              ,(char *)0x0,(char *)0x0,(char *)0x0,local_200,(bool *)0x0);
          if (local_200 != &local_1f0) {
            operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
          }
          glu::CallLogWrapper::glGenTextures(pCVar1,2,(GLuint *)&data);
          std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
                    ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)textures,
                     0xc00,(value_type *)&local_1d8,(allocator_type *)&name_index_map);
          glu::CallLogWrapper::glBindTexture
                    (pCVar1,0x8513,
                     (GLuint)data.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2801,0x2600);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2800,0x2600);
          glu::CallLogWrapper::glTexImage2D
                    (pCVar1,0x8516,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
          glu::CallLogWrapper::glTexImage2D
                    (pCVar1,0x8515,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
          glu::CallLogWrapper::glTexImage2D
                    (pCVar1,0x8518,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
          glu::CallLogWrapper::glTexImage2D
                    (pCVar1,0x8517,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
          glu::CallLogWrapper::glTexImage2D
                    (pCVar1,0x851a,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
          glu::CallLogWrapper::glTexImage2D
                    (pCVar1,0x8519,0,0x8d82,0x10,0x10,0,0x8d99,0x1404,(void *)textures._0_8_);
          glu::CallLogWrapper::glBindTexture(pCVar1,0x8513,0);
          glu::CallLogWrapper::glBindTexture
                    (pCVar1,0x9009,
                     data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x9009,0x2801,0x2600);
          glu::CallLogWrapper::glTexParameteri(pCVar1,0x9009,0x2800,0x2600);
          glu::CallLogWrapper::glTexImage3D
                    (pCVar1,0x9009,0,0x8d82,0x10,0x10,0xc,0,0x8d99,0x1404,(void *)textures._0_8_);
          glu::CallLogWrapper::glBindTexture(pCVar1,0x9009,0);
          glu::CallLogWrapper::glBindImageTexture
                    (pCVar1,0,(GLuint)data.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,
                     0x8d82);
          pvVar17 = (vec4 *)0x0;
          glu::CallLogWrapper::glBindImageTexture
                    (pCVar1,1,data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,
                     0x8d82);
          glu::CallLogWrapper::glClear(pCVar1,0x4000);
          glu::CallLogWrapper::glUseProgram(pCVar1,GVar10);
          GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_cube");
          glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,0);
          GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_cube_array");
          glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,1);
          glu::CallLogWrapper::glBindVertexArray(pCVar1,*local_1e0);
          iVar15 = 0x10;
          glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
          glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
          name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
          bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                            (&local_510->super_ShaderImageLoadStoreBase,0x10,0x10,
                             (int)&name_index_map,iVar15,pvVar17);
          GVar16 = (GLenum)pvVar17;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
               0xffffffff00000000;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
          name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
          glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar10,0x8b86,(GLint *)&buffer);
          if (buffer != 2) {
            bVar4 = false;
            anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
          }
          if (buffer != 0) {
            GVar14 = 0;
            do {
              pcVar18 = name;
              glu::CallLogWrapper::glGetActiveUniformName
                        (local_208,GVar10,GVar14,0x20,(GLsizei *)0x0,name);
              GVar16 = (GLenum)pcVar18;
              local_508 = &local_4f8;
              sVar13 = strlen(name);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_508,name,name + sVar13);
              local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
              local_540.first.field_2._M_allocated_capacity._0_4_ =
                   (undefined4)local_4f8._M_allocated_capacity;
              local_540.first.field_2._M_local_buf[6] = (char)((ulong)local_4f8._0_8_ >> 0x30);
              local_540.first.field_2._M_local_buf[7] = (char)((ulong)local_4f8._0_8_ >> 0x38);
              local_540.first.field_2._M_allocated_capacity._4_2_ =
                   (undefined2)((ulong)local_4f8._0_8_ >> 0x20);
              if (local_508 == &local_4f8) {
                local_540.first.field_2._M_local_buf[8] = local_4f8._M_local_buf[8];
                local_540.first.field_2._M_local_buf[9] = (char)local_4f8._9_7_;
                local_540.first.field_2._M_local_buf[10] = (char)((uint7)local_4f8._9_7_ >> 8);
                local_540.first.field_2._M_local_buf[0xb] = (char)((uint7)local_4f8._9_7_ >> 0x10);
                local_540.first.field_2._M_local_buf[0xc] = (char)((uint7)local_4f8._9_7_ >> 0x18);
                local_540.first.field_2._M_local_buf[0xd] = (char)((uint7)local_4f8._9_7_ >> 0x20);
                local_540.first.field_2._M_local_buf[0xe] = (char)((uint7)local_4f8._9_7_ >> 0x28);
                local_540.first.field_2._M_local_buf[0xf] = (char)((uint7)local_4f8._9_7_ >> 0x30);
              }
              else {
                local_540.first._M_dataplus._M_p = (pointer)local_508;
              }
              local_540.first._M_string_length = local_500;
              local_500 = 0;
              local_4f8._M_allocated_capacity = local_4f8._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_540.second = GVar14;
              local_508 = &local_4f8;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                          *)&name_index_map,&local_540);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
                operator_delete(local_540.first._M_dataplus._M_p,
                                CONCAT17(local_540.first.field_2._M_local_buf[7],
                                         CONCAT16(local_540.first.field_2._M_local_buf[6],
                                                  CONCAT24(local_540.first.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_540.first.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              if (local_508 != &local_4f8) {
                operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
              }
              GVar14 = GVar14 + 1;
            } while (GVar14 < buffer);
          }
          paVar2 = &local_540.first.field_2;
          local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
          local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
          local_540.first.field_2._M_local_buf[6] = 'e';
          local_540.first.field_2._M_local_buf[7] = '_';
          local_540.first.field_2._M_local_buf[8] = 'c';
          local_540.first.field_2._M_local_buf[9] = 'u';
          local_540.first.field_2._M_local_buf[10] = 'b';
          local_540.first.field_2._M_local_buf[0xb] = 'e';
          local_540.first._M_string_length = 0xc;
          local_540.first.field_2._M_local_buf[0xc] = '\0';
          local_540.first._M_dataplus._M_p = (pointer)paVar2;
          bVar5 = ShaderImageLoadStoreBase::CheckUniform
                            (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                             &name_index_map,0x905b,GVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540.first._M_dataplus._M_p != paVar2) {
            operator_delete(local_540.first._M_dataplus._M_p,
                            CONCAT17(local_540.first.field_2._M_local_buf[7],
                                     CONCAT16(local_540.first.field_2._M_local_buf[6],
                                              CONCAT24(local_540.first.field_2._M_allocated_capacity
                                                       ._4_2_,local_540.first.field_2.
                                                              _M_allocated_capacity._0_4_))) + 1);
          }
          local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
          name[0] = '\x12';
          name[1] = '\0';
          name[2] = '\0';
          name[3] = '\0';
          name[4] = '\0';
          name[5] = '\0';
          name[6] = '\0';
          name[7] = '\0';
          local_540.first._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_540,(ulong)name);
          pCVar1 = local_208;
          local_540.first.field_2._M_allocated_capacity._0_4_ = (undefined4)name._0_8_;
          local_540.first.field_2._M_allocated_capacity._4_2_ = SUB82(name._0_8_,4);
          local_540.first.field_2._M_local_buf[6] = SUB81(name._0_8_,6);
          local_540.first.field_2._M_local_buf[7] = SUB81(name._0_8_,7);
          builtin_strncpy(local_540.first._M_dataplus._M_p,"g_image_cube_array",0x12);
          local_540.first._M_string_length._0_1_ = name[0];
          local_540.first._M_string_length._1_1_ = name[1];
          local_540.first._M_string_length._2_1_ = name[2];
          local_540.first._M_string_length._3_1_ = name[3];
          local_540.first._M_string_length._4_1_ = name[4];
          local_540.first._M_string_length._5_1_ = name[5];
          local_540.first._M_string_length._6_1_ = name[6];
          local_540.first._M_string_length._7_1_ = name[7];
          local_540.first._M_dataplus._M_p[name._0_8_] = '\0';
          bVar6 = ShaderImageLoadStoreBase::CheckUniform
                            (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                             &name_index_map,0x905f,GVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
            operator_delete(local_540.first._M_dataplus._M_p,
                            CONCAT17(local_540.first.field_2._M_local_buf[7],
                                     CONCAT16(local_540.first.field_2._M_local_buf[6],
                                              CONCAT24(local_540.first.field_2._M_allocated_capacity
                                                       ._4_2_,local_540.first.field_2.
                                                              _M_allocated_capacity._0_4_))) + 1);
          }
          glu::CallLogWrapper::glUseProgram(pCVar1,0);
          glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar10);
          glu::CallLogWrapper::glDeleteTextures(pCVar1,2,(GLuint *)&data);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::~_Rb_tree(&name_index_map._M_t);
          if (textures._0_8_ != 0) {
            operator_delete((void *)textures._0_8_,
                            CONCAT44(textures[5],
                                     CONCAT22(textures[4]._2_2_,
                                              CONCAT11(textures[4]._1_1_,(undefined1)textures[4])))
                            - textures._0_8_);
          }
          if ((bVar4 & bVar5 & bVar6) == 1) {
            local_1d8.m_data[0] = 1.4013e-45;
            local_1d8.m_data[1] = 1.4013e-44;
            local_1d8.m_data[2] = 2.8026e-43;
            local_1d8.m_data[3] = 4.2039e-42;
            local_478.m_data[0] = 1.4013e-45;
            local_478.m_data[1] = 1.4013e-44;
            local_478.m_data[2] = 2.8026e-43;
            local_478.m_data[3] = 4.2039e-42;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_index_map);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name_index_map,
                       "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(",0x40);
            local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
            local_540.first.field_2._M_allocated_capacity._0_4_ = 0x61626772;
            local_540.first.field_2._M_allocated_capacity._4_2_ = 0x3233;
            local_540.first.field_2._M_local_buf[6] = 'u';
            local_540.first.field_2._M_local_buf[7] = 'i';
            local_540.first._M_string_length = 8;
            local_540.first.field_2._M_local_buf[8] = '\0';
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&name_index_map,local_540.first._M_dataplus._M_p,8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
            name._0_8_ = name + 0x10;
            name[0x10] = 'u';
            name[0x11] = '\0';
            name[8] = '\x01';
            name[9] = '\0';
            name[10] = '\0';
            name[0xb] = '\0';
            name[0xc] = '\0';
            name[0xd] = '\0';
            name[0xe] = '\0';
            name[0xf] = '\0';
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)name._0_8_,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"imageCube g_image_cube;\nlayout(",0x1f);
            local_508 = &local_4f8;
            local_4f8._M_allocated_capacity = 0x6975323361626772;
            local_500 = 8;
            local_4f8._M_local_buf[8] = '\0';
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,local_508->_M_local_buf,8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") readonly uniform ",0x13);
            textures._0_8_ = textures + 4;
            textures[4]._0_1_ = 0x75;
            textures[4]._1_1_ = 0;
            textures[2] = 1;
            textures[3] = 0;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)textures._0_8_,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       "imageCubeArray g_image_cube_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
                       ,0x81);
            data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)&data.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT62(data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,0x75);
            data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)data.
                                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       "vec4 v;\n  v = imageLoad(g_image_cube, ivec3(coord, 0));\n  if (v != ",0x43)
            ;
            _buffer = &local_488;
            local_488 = 'u';
            uStack_487 = 0;
            local_490 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,_buffer,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube, ivec3(coord, 1));\n  if (v != "
                       ,0x61);
            _uniforms = &local_428;
            local_428 = CONCAT62(local_428._2_6_,0x75);
            local_430 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)_uniforms,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube, ivec3(coord, 2));\n  if (v != "
                       ,0x62);
            local_228 = &local_218;
            local_218 = 'u';
            uStack_217 = 0;
            local_220 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_228,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube, ivec3(coord, 3));\n  if (v != "
                       ,0x61);
            local_3c8 = &local_3b8;
            local_3b8 = CONCAT62(local_3b8._2_6_,0x75);
            local_3c0 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)local_3c8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube, ivec3(coord, 4));\n  if (v != "
                       ,0x62);
            local_248 = &local_238;
            local_238 = 'u';
            uStack_237 = 0;
            local_240 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_248,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube, ivec3(coord, 5));\n  if (v != "
                       ,0x61);
            local_3e8 = &local_3d8;
            local_3d8 = CONCAT62(local_3d8._2_6_,0x75);
            local_3e0 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)local_3e8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 0));\n  if (v != "
                       ,0x68);
            local_268 = &local_258;
            local_258 = 'u';
            uStack_257 = 0;
            local_260 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_268,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.05);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 1));\n  if (v != "
                       ,0x68);
            local_408 = &local_3f8;
            local_3f8 = CONCAT62(local_3f8._2_6_,0x75);
            local_400 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)local_408,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 2));\n  if (v != "
                       ,0x67);
            local_288 = &local_278;
            local_278 = 'u';
            uStack_277 = 0;
            local_280 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_288,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.15);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 3));\n  if (v != "
                       ,0x68);
            local_2a8 = &local_298;
            local_298 = 'u';
            uStack_297 = 0;
            local_2a0 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2a8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.2);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 4));\n  if (v != "
                       ,0x67);
            local_2c8 = &local_2b8;
            local_2b8 = 'u';
            uStack_2b7 = 0;
            local_2c0 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2c8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.25);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 5));\n  if (v != "
                       ,0x68);
            local_2e8 = &local_2d8;
            local_2d8 = 'u';
            uStack_2d7 = 0;
            local_2e0 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_2e8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.3);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 6));\n  if (v != "
                       ,0x67);
            local_308 = &local_2f8;
            local_2f8 = 'u';
            uStack_2f7 = 0;
            local_300 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_308,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.35);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 7));\n  if (v != "
                       ,0x68);
            local_328 = &local_318;
            local_318 = 'u';
            uStack_317 = 0;
            local_320 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_328,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.4);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 8));\n  if (v != "
                       ,0x67);
            local_348 = &local_338;
            local_338 = 'u';
            uStack_337 = 0;
            local_340 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_348,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.45);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 9));\n  if (v != "
                       ,0x68);
            local_368 = &local_358;
            local_358 = 'u';
            uStack_357 = 0;
            local_360 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_368,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.5);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 10));\n  if (v != "
                       ,0x68);
            local_388 = &local_378;
            local_378 = 'u';
            uStack_377 = 0;
            local_380 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_388,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ") o_color = vec4(1.0, 0.0, 0.0, 0.55);\n  v = imageLoad(g_image_cube_array, ivec3(coord, 11));\n  if (v != "
                       ,0x69);
            local_3a8 = &local_398;
            local_398 = 'u';
            uStack_397 = 0;
            local_3a0 = 1;
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_3a8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"vec4",4);
            poVar12 = tcu::operator<<(poVar12,(Vector<unsigned_int,_4> *)&local_478);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,") o_color = vec4(1.0, 0.0, 0.0, 0.6);\n}",0x27);
            if (local_3a8 != &local_398) {
              operator_delete(local_3a8,CONCAT62(uStack_396,CONCAT11(uStack_397,local_398)) + 1);
            }
            if (local_388 != &local_378) {
              operator_delete(local_388,CONCAT62(uStack_376,CONCAT11(uStack_377,local_378)) + 1);
            }
            if (local_368 != &local_358) {
              operator_delete(local_368,CONCAT62(uStack_356,CONCAT11(uStack_357,local_358)) + 1);
            }
            if (local_348 != &local_338) {
              operator_delete(local_348,CONCAT62(uStack_336,CONCAT11(uStack_337,local_338)) + 1);
            }
            if (local_328 != &local_318) {
              operator_delete(local_328,CONCAT62(uStack_316,CONCAT11(uStack_317,local_318)) + 1);
            }
            if (local_308 != &local_2f8) {
              operator_delete(local_308,CONCAT62(uStack_2f6,CONCAT11(uStack_2f7,local_2f8)) + 1);
            }
            if (local_2e8 != &local_2d8) {
              operator_delete(local_2e8,CONCAT62(uStack_2d6,CONCAT11(uStack_2d7,local_2d8)) + 1);
            }
            if (local_2c8 != &local_2b8) {
              operator_delete(local_2c8,CONCAT62(uStack_2b6,CONCAT11(uStack_2b7,local_2b8)) + 1);
            }
            if (local_2a8 != &local_298) {
              operator_delete(local_2a8,CONCAT62(uStack_296,CONCAT11(uStack_297,local_298)) + 1);
            }
            if (local_288 != &local_278) {
              operator_delete(local_288,CONCAT62(uStack_276,CONCAT11(uStack_277,local_278)) + 1);
            }
            if (local_408 != &local_3f8) {
              operator_delete(local_408,local_3f8 + 1);
            }
            if (local_268 != &local_258) {
              operator_delete(local_268,CONCAT62(uStack_256,CONCAT11(uStack_257,local_258)) + 1);
            }
            if (local_3e8 != &local_3d8) {
              operator_delete(local_3e8,local_3d8 + 1);
            }
            if (local_248 != &local_238) {
              operator_delete(local_248,CONCAT62(uStack_236,CONCAT11(uStack_237,local_238)) + 1);
            }
            if (local_3c8 != &local_3b8) {
              operator_delete(local_3c8,local_3b8 + 1);
            }
            if (local_228 != &local_218) {
              operator_delete(local_228,CONCAT62(uStack_216,CONCAT11(uStack_217,local_218)) + 1);
            }
            if (_uniforms != &local_428) {
              operator_delete(_uniforms,local_428 + 1);
            }
            if (_buffer != &local_488) {
              operator_delete(_buffer,CONCAT62(uStack_486,CONCAT11(uStack_487,local_488)) + 1);
            }
            if (data.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (pointer)&data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)(data.
                                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            m_data + 1));
            }
            if ((GLuint *)textures._0_8_ != textures + 4) {
              operator_delete((void *)textures._0_8_,
                              CONCAT44(textures[5],
                                       CONCAT22(textures[4]._2_2_,
                                                CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))
                                      ) + 1);
            }
            if (local_508 != &local_4f8) {
              operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
            }
            if ((GLchar *)name._0_8_ != name + 0x10) {
              operator_delete((void *)name._0_8_,
                              CONCAT62(name._18_6_,CONCAT11(name[0x11],name[0x10])) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
              operator_delete(local_540.first._M_dataplus._M_p,
                              CONCAT17(local_540.first.field_2._M_local_buf[7],
                                       CONCAT16(local_540.first.field_2._M_local_buf[6],
                                                CONCAT24(local_540.first.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            p_Var3 = &name_index_map._M_t._M_impl.super__Rb_tree_header;
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_index_map);
            std::ios_base::~ios_base(local_138);
            GVar10 = ShaderImageLoadStoreBase::BuildProgram
                               (&local_510->super_ShaderImageLoadStoreBase,
                                "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                                ,(char *)0x0,(char *)0x0,(char *)0x0,local_200,(bool *)0x0);
            if (local_200 != &local_1f0) {
              operator_delete(local_200,CONCAT62(uStack_1ee,CONCAT11(uStack_1ef,local_1f0)) + 1);
            }
            glu::CallLogWrapper::glGenTextures(pCVar1,2,(GLuint *)&data);
            std::
            vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
            vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    *)textures,0xc00,(value_type *)&local_1d8,(allocator_type *)&name_index_map);
            glu::CallLogWrapper::glBindTexture
                      (pCVar1,0x8513,
                       (GLuint)data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2801,0x2600);
            glu::CallLogWrapper::glTexParameteri(pCVar1,0x8513,0x2800,0x2600);
            glu::CallLogWrapper::glTexImage2D
                      (pCVar1,0x8516,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
            glu::CallLogWrapper::glTexImage2D
                      (pCVar1,0x8515,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
            glu::CallLogWrapper::glTexImage2D
                      (pCVar1,0x8518,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
            glu::CallLogWrapper::glTexImage2D
                      (pCVar1,0x8517,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
            glu::CallLogWrapper::glTexImage2D
                      (pCVar1,0x851a,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
            glu::CallLogWrapper::glTexImage2D
                      (pCVar1,0x8519,0,0x8d70,0x10,0x10,0,0x8d99,0x1405,(void *)textures._0_8_);
            glu::CallLogWrapper::glBindTexture(pCVar1,0x8513,0);
            glu::CallLogWrapper::glBindTexture
                      (pCVar1,0x9009,
                       data.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_);
            glu::CallLogWrapper::glTexParameteri(pCVar1,0x9009,0x2801,0x2600);
            glu::CallLogWrapper::glTexParameteri(pCVar1,0x9009,0x2800,0x2600);
            glu::CallLogWrapper::glTexImage3D
                      (pCVar1,0x9009,0,0x8d70,0x10,0x10,0xc,0,0x8d99,0x1405,(void *)textures._0_8_);
            glu::CallLogWrapper::glBindTexture(pCVar1,0x9009,0);
            glu::CallLogWrapper::glBindImageTexture
                      (pCVar1,0,(GLuint)data.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,0,'\x01',0,35000,
                       0x8d70);
            pvVar17 = (vec4 *)0x0;
            glu::CallLogWrapper::glBindImageTexture
                      (pCVar1,1,data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,0,'\x01',0,35000,
                       0x8d70);
            glu::CallLogWrapper::glClear(pCVar1,0x4000);
            glu::CallLogWrapper::glUseProgram(pCVar1,GVar10);
            GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_cube");
            glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,0);
            GVar11 = glu::CallLogWrapper::glGetUniformLocation(pCVar1,GVar10,"g_image_cube_array");
            glu::CallLogWrapper::glUniform1i(pCVar1,GVar11,1);
            glu::CallLogWrapper::glBindVertexArray(pCVar1,*local_1e0);
            iVar15 = 0x10;
            glu::CallLogWrapper::glViewport(pCVar1,0,0,0x10,0x10);
            glu::CallLogWrapper::glDrawArrays(pCVar1,5,0,4);
            name_index_map._M_t._M_impl._0_8_ = 0x3f80000000000000;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
            bVar4 = ShaderImageLoadStoreBase::ValidateReadBuffer
                              (&local_510->super_ShaderImageLoadStoreBase,0x10,0x10,
                               (int)&name_index_map,iVar15,pvVar17);
            GVar16 = (GLenum)pvVar17;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                 0xffffffff00000000;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header
            ;
            name_index_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var3->_M_header;
            local_1e0._0_4_ = (int)CONCAT71(extraout_var,bVar4);
            glu::CallLogWrapper::glGetProgramiv(pCVar1,GVar10,0x8b86,(GLint *)&buffer);
            if (buffer != 2) {
              local_1e0._0_4_ = 0;
              anon_unknown_0::Output("ACTIVE_UNIFORMS is %d should be 2.\n");
            }
            if (buffer != 0) {
              GVar14 = 0;
              do {
                pcVar18 = name;
                glu::CallLogWrapper::glGetActiveUniformName
                          (local_208,GVar10,GVar14,0x20,(GLsizei *)0x0,name);
                GVar16 = (GLenum)pcVar18;
                local_508 = &local_4f8;
                sVar13 = strlen(name);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_508,name,name + sVar13);
                local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
                local_540.first.field_2._M_allocated_capacity._0_4_ =
                     (undefined4)local_4f8._M_allocated_capacity;
                local_540.first.field_2._M_local_buf[6] = (char)((ulong)local_4f8._0_8_ >> 0x30);
                local_540.first.field_2._M_local_buf[7] = (char)((ulong)local_4f8._0_8_ >> 0x38);
                local_540.first.field_2._M_allocated_capacity._4_2_ =
                     (undefined2)((ulong)local_4f8._0_8_ >> 0x20);
                if (local_508 == &local_4f8) {
                  local_540.first.field_2._M_local_buf[8] = local_4f8._M_local_buf[8];
                  local_540.first.field_2._M_local_buf[9] = (char)local_4f8._9_7_;
                  local_540.first.field_2._M_local_buf[10] = (char)((uint7)local_4f8._9_7_ >> 8);
                  local_540.first.field_2._M_local_buf[0xb] = (char)((uint7)local_4f8._9_7_ >> 0x10)
                  ;
                  local_540.first.field_2._M_local_buf[0xc] = (char)((uint7)local_4f8._9_7_ >> 0x18)
                  ;
                  local_540.first.field_2._M_local_buf[0xd] = (char)((uint7)local_4f8._9_7_ >> 0x20)
                  ;
                  local_540.first.field_2._M_local_buf[0xe] = (char)((uint7)local_4f8._9_7_ >> 0x28)
                  ;
                  local_540.first.field_2._M_local_buf[0xf] = (char)((uint7)local_4f8._9_7_ >> 0x30)
                  ;
                }
                else {
                  local_540.first._M_dataplus._M_p = (pointer)local_508;
                }
                local_540.first._M_string_length = local_500;
                local_500 = 0;
                local_4f8._M_allocated_capacity =
                     local_4f8._M_allocated_capacity & 0xffffffffffffff00;
                local_540.second = GVar14;
                local_508 = &local_4f8;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                            *)&name_index_map,&local_540);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
                  operator_delete(local_540.first._M_dataplus._M_p,
                                  CONCAT17(local_540.first.field_2._M_local_buf[7],
                                           CONCAT16(local_540.first.field_2._M_local_buf[6],
                                                    CONCAT24(local_540.first.field_2.
                                                             _M_allocated_capacity._4_2_,
                                                             local_540.first.field_2.
                                                             _M_allocated_capacity._0_4_))) + 1);
                }
                if (local_508 != &local_4f8) {
                  operator_delete(local_508,local_4f8._M_allocated_capacity + 1);
                }
                GVar14 = GVar14 + 1;
              } while (GVar14 < buffer);
            }
            paVar2 = &local_540.first.field_2;
            local_540.first.field_2._M_allocated_capacity._0_4_ = 0x6d695f67;
            local_540.first.field_2._M_allocated_capacity._4_2_ = 0x6761;
            local_540.first.field_2._M_local_buf[6] = 'e';
            local_540.first.field_2._M_local_buf[7] = '_';
            local_540.first.field_2._M_local_buf[8] = 'c';
            local_540.first.field_2._M_local_buf[9] = 'u';
            local_540.first.field_2._M_local_buf[10] = 'b';
            local_540.first.field_2._M_local_buf[0xb] = 'e';
            local_540.first._M_string_length = 0xc;
            local_540.first.field_2._M_local_buf[0xc] = '\0';
            local_540.first._M_dataplus._M_p = (pointer)paVar2;
            bVar4 = ShaderImageLoadStoreBase::CheckUniform
                              (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                               &name_index_map,0x9066,GVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_540.first._M_dataplus._M_p != paVar2) {
              operator_delete(local_540.first._M_dataplus._M_p,
                              CONCAT17(local_540.first.field_2._M_local_buf[7],
                                       CONCAT16(local_540.first.field_2._M_local_buf[6],
                                                CONCAT24(local_540.first.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_540.first._M_dataplus._M_p = (pointer)&local_540.first.field_2;
            name[0] = '\x12';
            name[1] = '\0';
            name[2] = '\0';
            name[3] = '\0';
            name[4] = '\0';
            name[5] = '\0';
            name[6] = '\0';
            name[7] = '\0';
            local_540.first._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_540,(ulong)name);
            pCVar1 = local_208;
            local_540.first.field_2._M_allocated_capacity._0_4_ = (undefined4)name._0_8_;
            local_540.first.field_2._M_allocated_capacity._4_2_ = SUB82(name._0_8_,4);
            local_540.first.field_2._M_local_buf[6] = SUB81(name._0_8_,6);
            local_540.first.field_2._M_local_buf[7] = SUB81(name._0_8_,7);
            builtin_strncpy(local_540.first._M_dataplus._M_p,"g_image_cube_array",0x12);
            local_540.first._M_string_length._0_1_ = name[0];
            local_540.first._M_string_length._1_1_ = name[1];
            local_540.first._M_string_length._2_1_ = name[2];
            local_540.first._M_string_length._3_1_ = name[3];
            local_540.first._M_string_length._4_1_ = name[4];
            local_540.first._M_string_length._5_1_ = name[5];
            local_540.first._M_string_length._6_1_ = name[6];
            local_540.first._M_string_length._7_1_ = name[7];
            local_540.first._M_dataplus._M_p[name._0_8_] = '\0';
            bVar5 = ShaderImageLoadStoreBase::CheckUniform
                              (&local_510->super_ShaderImageLoadStoreBase,GVar10,&local_540.first,
                               &name_index_map,0x906a,GVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_540.first._M_dataplus._M_p != &local_540.first.field_2) {
              operator_delete(local_540.first._M_dataplus._M_p,
                              CONCAT17(local_540.first.field_2._M_local_buf[7],
                                       CONCAT16(local_540.first.field_2._M_local_buf[6],
                                                CONCAT24(local_540.first.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_540.first.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            glu::CallLogWrapper::glUseProgram(pCVar1,0);
            glu::CallLogWrapper::glDeleteProgram(pCVar1,GVar10);
            glu::CallLogWrapper::glDeleteTextures(pCVar1,2,(GLuint *)&data);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::~_Rb_tree(&name_index_map._M_t);
            if (textures._0_8_ != 0) {
              operator_delete((void *)textures._0_8_,
                              CONCAT44(textures[5],
                                       CONCAT22(textures[4]._2_2_,
                                                CONCAT11(textures[4]._1_1_,(undefined1)textures[4]))
                                      ) - textures._0_8_);
            }
            return (ulong)((byte)local_1e0._0_4_ & bVar4 & bVar5) - 1;
          }
          return -1;
        }
      }
    }
  }
  return -1;
}

Assistant:

virtual long Run()
	{
		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		if (!Read(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!Read(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!Read(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		if (!ReadCube(GL_RGBA32F, vec4(-1.0f, 10.0f, -200.0f, 3000.0f), vec4(-1.0f, 10.0f, -200.0f, 3000.0f)))
			return ERROR;
		if (!ReadCube(GL_RGBA32I, ivec4(-1, 10, -200, 3000), ivec4(-1, 10, -200, 3000)))
			return ERROR;
		if (!ReadCube(GL_RGBA32UI, uvec4(1, 10, 200, 3000), uvec4(1, 10, 200, 3000)))
			return ERROR;

		return NO_ERROR;
	}